

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O3

shared_ptr<(anonymous_namespace)::schema> __thiscall
anon_unknown.dwarf_5714b::type_schema::make
          (type_schema *this,json *schema,value_t type,root_schema *root,
          vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *uris,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *kw)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Manager_type *this_01;
  _Invoker_type p_Var1;
  format_checker *this_02;
  size_type sVar2;
  element_type *this_03;
  pointer pcVar3;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
  *__a;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
  *ppVar4;
  _Base_ptr this_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
  *__args;
  json_value jVar6;
  _Base_ptr p_Var7;
  undefined8 uVar8;
  pointer pjVar9;
  _func_int **pp_Var10;
  char cVar11;
  value_t vVar12;
  bool bVar13;
  root_schema *prVar14;
  reference pbVar15;
  reference pbVar16;
  string_type *psVar17;
  string_type *psVar18;
  _Link_type p_Var19;
  uchar *puVar20;
  ulong uVar21;
  allocator_type *paVar22;
  undefined8 *puVar23;
  string_t *psVar24;
  invalid_argument *piVar25;
  root_schema *prVar26;
  undefined7 in_register_00000011;
  undefined **ppuVar27;
  type_schema *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var28;
  type_schema *extraout_RDX_00;
  type_schema *extraout_RDX_01;
  undefined8 uVar29;
  type_schema *extraout_RDX_02;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
  *__args_00;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
  *extraout_RDX_03;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
  *ppVar30;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
  *extraout_RDX_04;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
  *extraout_RDX_05;
  type_schema *extraout_RDX_06;
  type_schema *extraout_RDX_07;
  type_schema *extraout_RDX_08;
  type_schema *extraout_RDX_09;
  type_schema *extraout_RDX_10;
  ulong uVar31;
  allocator_type *__a_00;
  ulong uVar32;
  char cVar33;
  _Link_type p_Var34;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  long lVar35;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long *plVar36;
  _Rb_tree_node_base *p_Var37;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar38;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar39;
  shared_ptr<(anonymous_namespace)::schema> sVar40;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  iterator __begin4;
  unsigned_long ret_10;
  long ret;
  iterator __end4;
  size_type __dnew_4;
  size_type __dnew;
  json_value local_388;
  json_value local_380;
  undefined7 uStack_378;
  undefined1 uStack_371;
  undefined7 uStack_370;
  undefined1 uStack_369;
  json_value local_368;
  json_value jStack_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_348;
  long local_338 [8];
  json_value local_2f8;
  json_value jStack_2f0;
  json_value jStack_2e8;
  undefined2 uStack_2e0;
  undefined1 uStack_2de;
  undefined2 uStack_2dd;
  undefined1 uStack_2db;
  undefined2 uStack_2da;
  root_schema *local_288;
  root_schema *local_280;
  root_schema *local_278;
  string *local_270;
  json_value local_268;
  _Base_ptr p_Stack_260;
  pointer pbStack_258;
  long *plStack_250;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_240;
  type_schema *local_238;
  allocator_type local_229;
  json_value local_228;
  _Base_ptr p_Stack_220;
  json_value local_218;
  long *plStack_210;
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined1 local_1e8 [24];
  json_value local_1d0;
  _Base_ptr local_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> local_1b0;
  json_value local_198;
  _Base_ptr p_Stack_190;
  pointer pbStack_188;
  undefined8 local_180;
  _Rb_tree_node_base *local_178 [2];
  _Rb_tree_node_base local_168 [2];
  json_value local_120;
  _Base_ptr local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  long local_f0 [2];
  json_value local_e0;
  _Base_ptr local_d8;
  ulong uStack_d0;
  undefined8 local_c8;
  _func_int **local_c0;
  pointer pjStack_b8;
  iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_b0;
  schema local_a8;
  schema local_88;
  json_value local_68;
  _Base_ptr local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> local_48;
  
  local_368 = (json_value)schema;
  local_280 = root;
  local_270 = (string *)uris;
  local_238 = this;
  switch(CONCAT71(in_register_00000011,type) & 0xffffffff) {
  case 0:
    this = (type_schema *)operator_new(0x30);
    (this->super_schema).root_ = (root_schema *)0x100000001;
    *(undefined ***)&((_Function_base *)&(this->super_schema)._vptr_schema)->_M_functor =
         &PTR___Sp_counted_ptr_inplace_0015a238;
    (this->super_schema).default_value_.m_value.object = (object_t *)local_280;
    (((format_checker *)&this->type_)->super__Function_base)._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(((format_checker *)&this->type_)->super__Function_base)._M_functor + 8)
         = 0;
    ppuVar27 = &PTR_make_for_default__0015a288;
    break;
  case 1:
    prVar14 = (root_schema *)operator_new(0x100);
    *(undefined8 *)((long)&(prVar14->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(prVar14->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_0015a558;
    (prVar14->loader_)._M_invoker = (_Invoker_type)local_280;
    (prVar14->format_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar14->format_check_).super__Function_base._M_functor + 8) = 0;
    (prVar14->loader_).super__Function_base._M_manager =
         (_Manager_type)&PTR_make_for_default__0015a5a8;
    *(undefined1 *)&(prVar14->format_check_).super__Function_base._M_manager = 0;
    (prVar14->format_check_)._M_invoker = (_Invoker_type)0x0;
    (prVar14->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined4 *)&(prVar14->files_)._M_t._M_impl = 0;
    *(undefined8 *)&(prVar14->files_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    *(undefined8 *)((long)&(prVar14->content_check_).super__Function_base._M_functor + 8) = 0;
    (prVar14->content_check_).super__Function_base._M_manager = (_Manager_type)0x0;
    (prVar14->content_check_)._M_invoker = (_Invoker_type)0x0;
    (prVar14->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (prVar14->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&prVar14->files_;
    (prVar14->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)&prVar14->files_;
    local_240 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                &(prVar14->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    p_Var1 = (_Invoker_type)((long)&prVar14[1].format_check_.super__Function_base._M_functor + 8);
    *(undefined4 *)((long)&prVar14[1].format_check_.super__Function_base._M_functor + 8) = 0;
    prVar14[1].format_check_.super__Function_base._M_manager = (_Manager_type)0x0;
    (prVar14->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    (prVar14->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined8 *)&prVar14[1].loader_.super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&prVar14[1].loader_.super__Function_base._M_functor + 8) = 0;
    prVar14[1].loader_.super__Function_base._M_manager = (_Manager_type)0x0;
    prVar14[1].loader_._M_invoker = (_Invoker_type)0x0;
    prVar14[1].format_check_._M_invoker = p_Var1;
    *(_Invoker_type *)&prVar14[1].content_check_.super__Function_base._M_functor = p_Var1;
    prVar14[1].content_check_._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)((long)&prVar14[1].content_check_.super__Function_base._M_functor + 8) = 0;
    prVar14[1].content_check_.super__Function_base._M_manager = (_Manager_type)0x0;
    local_380 = (json_value)0x0;
    uStack_378 = 0;
    uStack_371 = 0;
    uStack_370 = 0;
    uStack_369 = 0x80;
    vVar12 = schema->m_type;
    local_288 = prVar14;
    if (vVar12 == object) {
      local_388 = (json_value)schema;
      local_380 = (json_value)
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                  ::_M_find_tr<char[14],void>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                              *)(schema->m_value).object,(char (*) [14])"maxProperties");
      vVar12 = schema->m_type;
LAB_0011ecd9:
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = 0;
      aStack_358._8_8_ = 0x8000000000000000;
      if (vVar12 == object) {
        jStack_360.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        if (vVar12 == array) {
          psVar24 = (string_t *)(schema->m_value).array;
          goto LAB_0011ed11;
        }
        aStack_358._8_8_ = 1;
      }
    }
    else {
      if (vVar12 != array) {
        uStack_370 = 1;
        uStack_369 = 0;
        local_388 = (json_value)schema;
        goto LAB_0011ecd9;
      }
      psVar24 = (schema->m_value).string;
      uStack_378 = (undefined7)psVar24->_M_string_length;
      uStack_371 = (undefined1)(psVar24->_M_string_length >> 0x38);
      local_388 = (json_value)schema;
LAB_0011ed11:
      aStack_358._8_8_ = 0x8000000000000000;
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = psVar24->_M_string_length;
    }
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368);
    if (!bVar13) {
      pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_388);
      local_368.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
                (pbVar16,&local_368.number_unsigned);
      *(undefined1 *)&(local_288->format_check_).super__Function_base._M_manager = 1;
      (local_288->format_check_)._M_invoker = (_Invoker_type)local_368;
      local_268 = local_388;
      pbStack_258 = (pointer)CONCAT17(uStack_371,uStack_378);
      p_Stack_260 = (_Base_ptr)local_380;
      plStack_250 = (long *)CONCAT17(uStack_369,uStack_370);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_368,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_268);
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      local_380 = (json_value)
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                  ::_M_find_tr<char[14],void>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                              *)(schema->m_value).object,(char (*) [14])"minProperties");
      vVar12 = schema->m_type;
      uVar29 = 0x8000000000000000;
LAB_0011f1fe:
      uStack_378 = 0;
      uStack_371 = 0;
      uStack_370 = (undefined7)uVar29;
      uStack_369 = (undefined1)((ulong)uVar29 >> 0x38);
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = 0;
      aStack_358._8_8_ = 0x8000000000000000;
      if (vVar12 == object) {
        jStack_360.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        if (vVar12 == array) {
          psVar24 = (string_t *)(schema->m_value).array;
          goto LAB_0011f245;
        }
        aStack_358._8_8_ = 1;
      }
    }
    else {
      if (vVar12 != array) {
        local_380 = (json_value)0x0;
        uVar29 = 1;
        goto LAB_0011f1fe;
      }
      psVar24 = (schema->m_value).string;
      local_380 = (json_value)0x0;
      uStack_378 = (undefined7)psVar24->_M_string_length;
      uStack_371 = (undefined1)(psVar24->_M_string_length >> 0x38);
      uStack_370 = 0;
      uStack_369 = 0x80;
LAB_0011f245:
      aStack_358._8_8_ = 0x8000000000000000;
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = psVar24->_M_string_length;
    }
    local_388 = (json_value)schema;
    local_368 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368);
    if (!bVar13) {
      pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_388);
      local_368.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
                (pbVar16,&local_368.number_unsigned);
      (local_288->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\x01';
      ((json_value *)((long)&(local_288->content_check_).super__Function_base._M_functor + 8))->
      object = (object_t *)local_368;
      local_228.string = local_388.string;
      local_218.number_integer._7_1_ = uStack_371;
      local_218.number_integer._0_7_ = uStack_378;
      p_Stack_220 = (_Base_ptr)local_380;
      plStack_210 = (long *)CONCAT17(uStack_369,uStack_370);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_368,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_228);
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      local_380 = (json_value)
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                  ::_M_find_tr<char[9],void>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                              *)(schema->m_value).object,(char (*) [9])"required");
      vVar12 = schema->m_type;
      uVar29 = 0x8000000000000000;
LAB_0011f86f:
      uStack_378 = 0;
      uStack_371 = 0;
      uStack_370 = (undefined7)uVar29;
      uStack_369 = (undefined1)((ulong)uVar29 >> 0x38);
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = 0;
      aStack_358._8_8_ = 0x8000000000000000;
      if (vVar12 == array) goto LAB_0011f8c0;
      if (vVar12 == object) {
        jStack_360.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        aStack_358._8_8_ = 1;
      }
    }
    else {
      if (vVar12 != array) {
        local_380 = (json_value)0x0;
        uVar29 = 1;
        goto LAB_0011f86f;
      }
      sVar2 = ((schema->m_value).string)->_M_string_length;
      local_380 = (json_value)0x0;
      uStack_378 = (undefined7)sVar2;
      uStack_371 = (undefined1)(sVar2 >> 0x38);
      uStack_370 = 0;
      uStack_369 = 0x80;
LAB_0011f8c0:
      aStack_358._8_8_ = 0x8000000000000000;
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    local_388 = (json_value)schema;
    local_368 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368);
    if (!bVar13) {
      pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_388);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      get_impl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                (&local_2f8,pbVar16);
      aStack_358._M_allocated_capacity =
           (size_type)
           (local_288->root_).
           super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (local_288->root_).
      super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT17(jStack_2e8.number_integer._7_1_,
                    CONCAT25(jStack_2e8.number_integer._5_2_,
                             CONCAT14(jStack_2e8.number_integer._4_1_,
                                      jStack_2e8.number_integer._0_4_)));
      local_368 = (json_value)(local_288->content_check_).super__Function_base._M_manager;
      jStack_360 = (json_value)(local_288->content_check_)._M_invoker;
      (local_288->content_check_).super__Function_base._M_manager = (_Manager_type)local_2f8;
      (local_288->content_check_)._M_invoker = (_Invoker_type)jStack_2f0;
      local_2f8.object = (object_t *)0x0;
      jStack_2f0 = (json_value)0x0;
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_368);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_2f8);
      local_68 = local_388;
      uStack_58 = CONCAT17(uStack_371,uStack_378);
      local_60 = (_Base_ptr)local_380;
      local_50 = CONCAT17(uStack_369,uStack_370);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_368,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_68);
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      local_380 = (json_value)
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                  ::_M_find_tr<char[11],void>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                              *)(schema->m_value).object,(char (*) [11])0x145127);
      vVar12 = schema->m_type;
      uVar29 = 0x8000000000000000;
LAB_0011ff0f:
      uStack_378 = 0;
      uStack_371 = 0;
      uStack_370 = (undefined7)uVar29;
      uStack_369 = (undefined1)((ulong)uVar29 >> 0x38);
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = 0;
      aStack_358._8_8_ = -0x8000000000000000;
      if (vVar12 == array) goto LAB_0011ff60;
      if (vVar12 == object) {
        jStack_360.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        aStack_358._8_8_ = 1;
      }
    }
    else {
      if (vVar12 != array) {
        local_380.object = (object_t *)0x0;
        uVar29 = 1;
        goto LAB_0011ff0f;
      }
      sVar2 = ((schema->m_value).string)->_M_string_length;
      local_380.object = (object_t *)0x0;
      uStack_378 = (undefined7)sVar2;
      uStack_371 = (undefined1)(sVar2 >> 0x38);
      uStack_370 = 0;
      uStack_369 = 0x80;
LAB_0011ff60:
      aStack_358._8_8_ = -0x8000000000000000;
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    local_388 = (json_value)schema;
    local_368 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368);
    if (!bVar13) {
      local_1b0.super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)nlohmann::json_abi_v3_11_2::detail::
                    iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&local_388);
      this_00 = &(prVar14->root_).
                 super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::begin((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)&local_368,
              (iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)&local_1b0);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::end((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)&local_2f8,
            (iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)&local_1b0);
      while (bVar13 = nlohmann::json_abi_v3_11_2::detail::
                      iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::
                      operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)&local_368,
                                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)&local_2f8), !bVar13) {
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&local_198,
                   (iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&local_368);
        psVar17 = nlohmann::json_abi_v3_11_2::detail::
                  iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         *)&local_198);
        pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&local_198);
        local_120.object = (object_t *)&uStack_110;
        uStack_110 = 0x69747265706f7270;
        local_118 = (_Base_ptr)0xa;
        local_108 = CONCAT53(local_108._3_5_,0x7365);
        psVar18 = nlohmann::json_abi_v3_11_2::detail::
                  iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         *)&local_198);
        local_100._M_allocated_capacity = (size_type)local_f0;
        pcVar3 = (psVar18->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_100,pcVar3,pcVar3 + psVar18->_M_string_length);
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)&local_120;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_1e8 + 0x18),__l_00,(allocator_type *)&local_48);
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                  ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_88,
                   (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_270);
        anon_unknown.dwarf_5714b::schema::make
                  ((schema *)local_208,pbVar16,local_280,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_1e8 + 0x18),
                   (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_88);
        pcVar3 = (psVar17->_M_dataplus)._M_p;
        local_e0.object = (object_t *)&uStack_d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,pcVar3,pcVar3 + psVar17->_M_string_length);
        local_c0 = (_func_int **)local_208._0_8_;
        pjStack_b8 = (pointer)local_208._8_8_;
        local_208._0_8_ = (_func_int **)0x0;
        local_208._8_8_ = (pointer)0x0;
        p_Var19 = (_Link_type)operator_new(0x50);
        pjVar9 = pjStack_b8;
        p_Var34 = (_Link_type)&p_Var19->_M_storage;
        puVar20 = (p_Var19->_M_storage)._M_storage + 0x10;
        *(uchar **)(p_Var19->_M_storage)._M_storage = puVar20;
        if (local_e0.object == (object_t *)&uStack_d0) {
          *(ulong *)puVar20 = uStack_d0;
          *(undefined8 *)((p_Var19->_M_storage)._M_storage + 0x18) = local_c8;
        }
        else {
          *(json_value *)
           ((__aligned_membuf<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>
             *)p_Var34)->_M_storage = local_e0;
          *(ulong *)puVar20 = uStack_d0;
        }
        *(_Base_ptr *)((p_Var19->_M_storage)._M_storage + 8) = local_d8;
        local_d8 = (_Base_ptr)0x0;
        uStack_d0 = uStack_d0 & 0xffffffffffffff00;
        pjStack_b8 = (pointer)0x0;
        *(_func_int ***)((p_Var19->_M_storage)._M_storage + 0x20) = local_c0;
        *(pointer *)((p_Var19->_M_storage)._M_storage + 0x28) = pjVar9;
        local_c0 = (_func_int **)0x0;
        local_e0.object = (object_t *)&uStack_d0;
        pVar38 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                 ::_M_get_insert_unique_pos
                           ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                             *)this_00,(key_type *)p_Var34);
        if (pVar38.second == (_Base_ptr)0x0) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
          ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                          *)p_Var19,p_Var34);
        }
        else {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
          ::_M_insert_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                            *)this_00,pVar38.first,pVar38.second,p_Var19);
        }
        if (pjStack_b8 != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pjStack_b8);
        }
        if (local_e0.object != (object_t *)&uStack_d0) {
          operator_delete(local_e0.object,uStack_d0 + 1);
        }
        if ((pointer)local_208._8_8_ != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
        }
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                  ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_88);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1e8 + 0x18));
        lVar35 = -0x40;
        plVar36 = local_f0;
        do {
          if (plVar36 != (long *)plVar36[-2]) {
            operator_delete((long *)plVar36[-2],*plVar36 + 1);
          }
          plVar36 = plVar36 + -4;
          lVar35 = lVar35 + 0x20;
        } while (lVar35 != 0);
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::~iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&local_198);
        vVar12 = *(value_t *)&((local_368.object)->_M_t)._M_impl;
        if (vVar12 == array) {
          aStack_358._M_allocated_capacity = aStack_358._M_allocated_capacity + 0x10;
        }
        else if (vVar12 == object) {
          jStack_360.string = (string_t *)std::_Rb_tree_increment(jStack_360.string);
        }
        else {
          aStack_358._8_8_ = aStack_358._8_8_ + 1;
        }
        aStack_348._M_allocated_capacity = aStack_348._M_allocated_capacity + 1;
      }
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&local_2f8);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&local_368);
      local_e0 = local_388;
      uStack_d0 = CONCAT17(uStack_371,uStack_378);
      local_d8 = (_Base_ptr)local_380;
      local_c8 = CONCAT17(uStack_369,uStack_370);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_368,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_e0);
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      local_380 = (json_value)
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                  ::_M_find_tr<char[18],void>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                              *)(schema->m_value).object,(char (*) [18])"patternProperties");
      vVar12 = schema->m_type;
      uVar29 = 0x8000000000000000;
LAB_001206da:
      uStack_378 = 0;
      uStack_371 = 0;
      uStack_370 = (undefined7)uVar29;
      uStack_369 = (undefined1)((ulong)uVar29 >> 0x38);
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = 0;
      aStack_358._8_8_ = -0x8000000000000000;
      if (vVar12 == array) goto LAB_0012072b;
      if (vVar12 == object) {
        jStack_360.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        aStack_358._8_8_ = 1;
      }
    }
    else {
      if (vVar12 != array) {
        local_380 = (json_value)0x0;
        uVar29 = 1;
        goto LAB_001206da;
      }
      sVar2 = ((schema->m_value).string)->_M_string_length;
      local_380 = (json_value)0x0;
      uStack_378 = (undefined7)sVar2;
      uStack_371 = (undefined1)(sVar2 >> 0x38);
      uStack_370 = 0;
      uStack_369 = 0x80;
LAB_0012072b:
      aStack_358._8_8_ = -0x8000000000000000;
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    local_388 = (json_value)schema;
    local_368 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368);
    if (!bVar13) {
      local_1e8._0_8_ =
           nlohmann::json_abi_v3_11_2::detail::
           iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&local_388);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::begin((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)&local_368,
              (iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)local_1e8);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::end((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)&local_2f8,
            (iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)local_1e8);
      local_278 = (root_schema *)0x7fffffffffffffe0;
      while( true ) {
        bVar13 = nlohmann::json_abi_v3_11_2::detail::
                 iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::
                 operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                           ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_368,
                            (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2f8);
        if (bVar13) break;
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&local_198,
                   (iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&local_368);
        psVar17 = nlohmann::json_abi_v3_11_2::detail::
                  iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         *)&local_198);
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)(local_1e8 + 0x18),psVar17,
                   0x10);
        pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&local_198);
        psVar17 = nlohmann::json_abi_v3_11_2::detail::
                  iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         *)&local_198);
        pcVar3 = (psVar17->_M_dataplus)._M_p;
        local_208._0_8_ = local_208 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_208,pcVar3,pcVar3 + psVar17->_M_string_length);
        __l_01._M_len = 1;
        __l_01._M_array = (iterator)local_208;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_1b0,__l_01,(allocator_type *)&local_b0);
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                  (&local_48,
                   (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_270);
        anon_unknown.dwarf_5714b::schema::make
                  (&local_a8,pbVar16,local_280,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_1b0,&local_48);
        local_120.number_integer._0_4_ = local_1d0.number_integer._0_4_;
        std::locale::locale((locale *)&local_118,(locale *)&local_1c8);
        prVar26 = local_288;
        uStack_110 = uStack_1c0;
        local_108 = uStack_1b8;
        uStack_1c0 = 0;
        uStack_1b8 = 0;
        local_100._M_allocated_capacity = (size_type)local_a8._vptr_schema;
        local_100._8_8_ = local_a8.root_;
        local_a8._vptr_schema = (_func_int **)0x0;
        local_a8.root_ = (root_schema *)0x0;
        __a = *(pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
                **)&local_288[1].loader_.super__Function_base._M_functor;
        if (__a == *(pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
                     **)((long)&local_288[1].loader_.super__Function_base._M_functor + 8)) {
          ppVar4 = *(pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
                     **)local_240;
          if ((root_schema *)((long)__a - (long)ppVar4) == local_278) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          lVar35 = (long)__a - (long)ppVar4 >> 4;
          uVar31 = lVar35 * -0x5555555555555555;
          uVar21 = uVar31;
          if (__a == ppVar4) {
            uVar21 = 1;
          }
          uVar32 = uVar21 + uVar31;
          if (0x2aaaaaaaaaaaaa9 < uVar32) {
            uVar32 = 0x2aaaaaaaaaaaaaa;
          }
          if (CARRY8(uVar21,uVar31)) {
            uVar32 = 0x2aaaaaaaaaaaaaa;
          }
          if (uVar32 == 0) {
            paVar22 = (allocator_type *)0x0;
            ppVar30 = __args_00;
          }
          else {
            paVar22 = (allocator_type *)operator_new(uVar32 * 0x30);
            ppVar30 = extraout_RDX_03;
          }
          std::
          allocator_traits<std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>>>
          ::
          construct<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>,std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>>
                    (paVar22 + lVar35 * 0x10,
                     (pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
                      *)&local_120,ppVar30);
          __args = extraout_RDX_04;
          __a_00 = paVar22;
          prVar26 = local_288;
          for (ppVar30 = ppVar4; local_288 = prVar26, __a != ppVar30; ppVar30 = ppVar30 + 1) {
            std::
            allocator_traits<std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>>>
            ::
            construct<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>,std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>>
                      (__a_00,ppVar30,__args);
            p_Var5 = (ppVar30->second).
                     super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
            }
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                      (&ppVar30->first);
            __a_00 = __a_00 + 0x30;
            __args = extraout_RDX_05;
            prVar26 = local_288;
          }
          if (ppVar4 != (pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
                         *)0x0) {
            operator_delete(ppVar4,*(long *)((long)&prVar26[1].loader_.super__Function_base.
                                                    _M_functor + 8) - (long)ppVar4);
          }
          (prVar26->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)paVar22;
          *(allocator_type **)&prVar26[1].loader_.super__Function_base._M_functor = __a_00 + 0x30;
          *(allocator_type **)((long)&prVar26[1].loader_.super__Function_base._M_functor + 8) =
               paVar22 + uVar32 * 0x30;
        }
        else {
          std::
          allocator_traits<std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>>>
          ::
          construct<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>,std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>>
                    ((allocator_type *)__a,
                     (pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
                      *)&local_120,__args_00);
          *(long *)&prVar26[1].loader_.super__Function_base._M_functor =
               *(long *)&prVar26[1].loader_.super__Function_base._M_functor + 0x30;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_120);
        if (local_a8.root_ != (root_schema *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.root_);
        }
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector(&local_48);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1b0);
        if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
          operator_delete((void *)local_208._0_8_,local_1f8._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)(local_1e8 + 0x18));
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::~iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&local_198);
        vVar12 = *(value_t *)&((local_368.object)->_M_t)._M_impl;
        if (vVar12 == array) {
          aStack_358._M_allocated_capacity = aStack_358._M_allocated_capacity + 0x10;
        }
        else if (vVar12 == object) {
          jStack_360.string = (string_t *)std::_Rb_tree_increment(jStack_360.string);
        }
        else {
          aStack_358._8_8_ = aStack_358._8_8_ + 1;
        }
        aStack_348._M_allocated_capacity = aStack_348._M_allocated_capacity + 1;
      }
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&local_2f8);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&local_368);
      local_120 = local_388;
      uStack_110 = CONCAT17(uStack_371,uStack_378);
      local_118 = (_Base_ptr)local_380;
      local_108 = CONCAT17(uStack_369,uStack_370);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_368,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_120);
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      local_380 = (json_value)
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                  ::_M_find_tr<char[21],void>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                              *)(schema->m_value).object,(char (*) [21])"additionalProperties");
      vVar12 = schema->m_type;
      uVar29 = 0x8000000000000000;
LAB_0012132b:
      uStack_378 = 0;
      uStack_371 = 0;
      uStack_370 = (undefined7)uVar29;
      uStack_369 = (undefined1)((ulong)uVar29 >> 0x38);
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = 0;
      aStack_358._8_8_ = 0x8000000000000000;
      if (vVar12 == array) goto LAB_00121375;
      if (vVar12 == object) {
        jStack_360.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        aStack_358._8_8_ = 1;
      }
    }
    else {
      if (vVar12 != array) {
        local_380 = (json_value)0x0;
        uVar29 = 1;
        goto LAB_0012132b;
      }
      sVar2 = ((schema->m_value).string)->_M_string_length;
      local_380 = (json_value)0x0;
      uStack_378 = (undefined7)sVar2;
      uStack_371 = (undefined1)(sVar2 >> 0x38);
      uStack_370 = 0;
      uStack_369 = 0x80;
LAB_00121375:
      aStack_358._8_8_ = 0x8000000000000000;
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    local_388 = (json_value)schema;
    local_368 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368);
    if (!bVar13) {
      pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_388);
      local_1d0.number_integer = 0x14;
      local_368.object = (object_t *)&aStack_358;
      local_368.object =
           (object_t *)
           std::__cxx11::string::_M_create(&local_368.number_unsigned,(ulong)(local_1e8 + 0x18));
      aStack_358._M_allocated_capacity = (size_type)local_1d0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(local_368.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      )->_M_allocated_capacity = 0x6e6f697469646461;
      *(char *)&(((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)local_368)->_M_impl).super__Vector_impl_data._M_finish = 'a';
      *(char *)((long)&(((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)local_368)->_M_impl).super__Vector_impl_data._M_finish + 1) = 'l';
      *(char *)((long)&(((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)local_368)->_M_impl).super__Vector_impl_data._M_finish + 2) = 'P';
      *(char *)((long)&(((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)local_368)->_M_impl).super__Vector_impl_data._M_finish + 3) = 'r';
      *(char *)((long)&(((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)local_368)->_M_impl).super__Vector_impl_data._M_finish + 4) = 'o';
      *(char *)((long)&(((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)local_368)->_M_impl).super__Vector_impl_data._M_finish + 5) = 'p';
      *(char *)((long)&(((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)local_368)->_M_impl).super__Vector_impl_data._M_finish + 6) = 'e';
      *(char *)((long)&(((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)local_368)->_M_impl).super__Vector_impl_data._M_finish + 7) = 'r';
      *(undefined4 *)
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&(local_368.object)->_M_t + 1) = 0x73656974;
      jStack_360.string = local_1d0.string;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(local_368.object)->_M_t)->_M_local_buf[(long)local_1d0.object] = '\0';
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)&local_368;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_2f8,__l_02,(allocator_type *)(local_1e8 + 0x18));
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_208,
                 (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_270);
      anon_unknown.dwarf_5714b::schema::make
                ((schema *)&local_198,pbVar16,local_280,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_2f8,
                 (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_208);
      p_Var7 = p_Stack_190;
      jVar6 = local_198;
      local_198.object = (object_t *)0x0;
      p_Stack_190 = (_Base_ptr)0x0;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288[1].loader_._M_invoker;
      local_288[1].loader_.super__Function_base._M_manager = (_Manager_type)jVar6;
      local_288[1].loader_._M_invoker = (_Invoker_type)p_Var7;
      if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5),
         p_Stack_190 != (_Base_ptr)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Stack_190);
      }
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_208);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_2f8);
      if (local_368.object != (object_t *)&aStack_358) {
        operator_delete(local_368.object,(ulong)(aStack_358._M_allocated_capacity + 1));
      }
      local_1d0 = local_388;
      uStack_1c0 = CONCAT17(uStack_371,uStack_378);
      local_1c8 = (_Base_ptr)local_380;
      uStack_1b8 = CONCAT17(uStack_369,uStack_370);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_368,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)(local_1e8 + 0x18));
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      local_380 = (json_value)
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                  ::_M_find_tr<char[13],void>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                              *)(schema->m_value).object,(char (*) [13])"dependencies");
      vVar12 = schema->m_type;
      uVar29 = 0x8000000000000000;
LAB_0012158f:
      uStack_378 = 0;
      uStack_371 = 0;
      uStack_370 = (undefined7)uVar29;
      uStack_369 = (undefined1)((ulong)uVar29 >> 0x38);
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = 0;
      aStack_358._8_8_ = -0x8000000000000000;
      if (vVar12 == array) goto LAB_001215d9;
      if (vVar12 == object) {
        jStack_360.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        aStack_358._8_8_ = 1;
      }
    }
    else {
      if (vVar12 != array) {
        local_380.object = (object_t *)0x0;
        uVar29 = 1;
        goto LAB_0012158f;
      }
      sVar2 = ((schema->m_value).string)->_M_string_length;
      local_380.object = (object_t *)0x0;
      uStack_378 = (undefined7)sVar2;
      uStack_371 = (undefined1)(sVar2 >> 0x38);
      uStack_370 = 0;
      uStack_369 = 0x80;
LAB_001215d9:
      aStack_358._8_8_ = -0x8000000000000000;
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    local_388 = (json_value)schema;
    local_368 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368);
    if (!bVar13) {
      local_b0.container =
           nlohmann::json_abi_v3_11_2::detail::
           iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&local_388);
      this_02 = &prVar14[1].format_check_;
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::begin((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)&local_368,&local_b0);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::end((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)&local_2f8,&local_b0);
      while( true ) {
        bVar13 = nlohmann::json_abi_v3_11_2::detail::
                 iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::
                 operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                           ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_368,
                            (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2f8);
        if (bVar13) break;
        pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&local_368);
        if (pbVar16->m_type == array) {
          psVar17 = nlohmann::json_abi_v3_11_2::detail::
                    iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           *)&local_368);
          pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                    iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&local_368);
          nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                    (&local_198,pbVar16);
          puVar23 = (undefined8 *)operator_new(0x48);
          puVar23[1] = 0x100000001;
          *puVar23 = &PTR___Sp_counted_ptr_inplace_0015a5f8;
          puVar23[3] = local_280;
          *(undefined1 *)(puVar23 + 4) = 0;
          puVar23[5] = 0;
          puVar23[2] = &PTR_make_for_default__0015a648;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(puVar23 + 6),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_198);
          p_Var19 = (_Link_type)operator_new(0x50);
          p_Var34 = (_Link_type)&p_Var19->_M_storage;
          *(uchar **)(p_Var19->_M_storage)._M_storage = (p_Var19->_M_storage)._M_storage + 0x10;
          pcVar3 = (psVar17->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)p_Var34,pcVar3,pcVar3 + psVar17->_M_string_length);
          *(undefined8 **)((p_Var19->_M_storage)._M_storage + 0x20) = puVar23 + 2;
          *(undefined8 **)((p_Var19->_M_storage)._M_storage + 0x28) = puVar23;
          pVar38 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                   ::_M_get_insert_unique_pos
                             ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                               *)this_02,(key_type *)p_Var34);
          if (pVar38.second == (_Base_ptr)0x0) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
            ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                            *)p_Var19,p_Var34);
          }
          else {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
            ::_M_insert_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                              *)this_02,pVar38.first,pVar38.second,p_Var19);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_198);
        }
        else {
          psVar17 = nlohmann::json_abi_v3_11_2::detail::
                    iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           *)&local_368);
          pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                    iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&local_368);
          local_198.object = (object_t *)&pbStack_188;
          pbStack_188 = (pointer)0x6e65646e65706564;
          p_Stack_190 = (_Base_ptr)0xc;
          local_180 = CONCAT35(local_180._5_3_,0x73656963);
          psVar18 = nlohmann::json_abi_v3_11_2::detail::
                    iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           *)&local_368);
          local_178[0] = local_168;
          pcVar3 = (psVar18->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_178,pcVar3,pcVar3 + psVar18->_M_string_length);
          __l_03._M_len = 2;
          __l_03._M_array = (iterator)&local_198;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_1b0,__l_03,&local_229);
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_a8,
                     (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_270);
          anon_unknown.dwarf_5714b::schema::make
                    ((schema *)local_1e8,pbVar16,local_280,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_1b0,
                     (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_a8);
          p_Var19 = (_Link_type)operator_new(0x50);
          p_Var34 = (_Link_type)&p_Var19->_M_storage;
          *(uchar **)(p_Var19->_M_storage)._M_storage = (p_Var19->_M_storage)._M_storage + 0x10;
          pcVar3 = (psVar17->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)p_Var34,pcVar3,pcVar3 + psVar17->_M_string_length);
          uVar29 = local_1e8._8_8_;
          local_1e8._8_8_ = (root_schema *)0x0;
          *(undefined8 *)((p_Var19->_M_storage)._M_storage + 0x20) = local_1e8._0_8_;
          *(undefined8 *)((p_Var19->_M_storage)._M_storage + 0x28) = uVar29;
          local_1e8._0_8_ = (reference)0x0;
          pVar38 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                   ::_M_get_insert_unique_pos
                             ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                               *)this_02,(key_type *)p_Var34);
          if (pVar38.second == (_Base_ptr)0x0) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
            ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                            *)p_Var19,p_Var34);
          }
          else {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
            ::_M_insert_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                              *)this_02,pVar38.first,pVar38.second,p_Var19);
          }
          if ((root_schema *)local_1e8._8_8_ != (root_schema *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
          }
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1b0);
          lVar35 = -0x40;
          p_Var37 = local_168;
          do {
            if (p_Var37 != p_Var37[-1]._M_left) {
              operator_delete(p_Var37[-1]._M_left,*(long *)p_Var37 + 1);
            }
            p_Var37 = p_Var37 + -1;
            lVar35 = lVar35 + 0x20;
          } while (lVar35 != 0);
        }
        vVar12 = *(value_t *)&((local_368.object)->_M_t)._M_impl;
        if (vVar12 == array) {
          aStack_358._M_allocated_capacity = aStack_358._M_allocated_capacity + 0x10;
        }
        else if (vVar12 == object) {
          jStack_360.string = (string_t *)std::_Rb_tree_increment(jStack_360.string);
        }
        else {
          aStack_358._8_8_ = aStack_358._8_8_ + 1;
        }
        aStack_348._M_allocated_capacity = aStack_348._M_allocated_capacity + 1;
      }
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&local_2f8);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&local_368);
      local_368 = local_388;
      aStack_358._M_allocated_capacity = CONCAT17(uStack_371,uStack_378);
      jStack_360 = local_380;
      aStack_358._8_8_ = CONCAT17(uStack_369,uStack_370);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_2f8,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_368);
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      local_380 = (json_value)
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                  ::_M_find_tr<char[14],void>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                              *)(schema->m_value).object,(char (*) [14])"propertyNames");
      vVar12 = schema->m_type;
      uVar29 = 0x8000000000000000;
LAB_00121a35:
      uStack_378 = 0;
      uStack_371 = 0;
      uStack_370 = (undefined7)uVar29;
      uStack_369 = (undefined1)((ulong)uVar29 >> 0x38);
      jStack_2f0 = (json_value)0x0;
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      uStack_2e0 = 0;
      uStack_2da = 0x8000;
      if (vVar12 == array) goto LAB_00121a8b;
      if (vVar12 == object) {
        jStack_2f0.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        uStack_2e0 = 1;
        uStack_2da = 0;
      }
    }
    else {
      if (vVar12 != array) {
        local_380 = (json_value)0x0;
        uVar29 = 1;
        goto LAB_00121a35;
      }
      sVar2 = ((schema->m_value).string)->_M_string_length;
      local_380 = (json_value)0x0;
      uStack_378 = (undefined7)sVar2;
      uStack_371 = (undefined1)(sVar2 >> 0x38);
      uStack_370 = 0;
      uStack_369 = 0x80;
LAB_00121a8b:
      uStack_2da = 0x8000;
      uStack_2e0 = 0;
      jStack_2f0 = (json_value)0x0;
      sVar2 = ((schema->m_value).string)->_M_string_length;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
    }
    uStack_2db = 0;
    uStack_2dd = 0;
    uStack_2de = 0;
    local_388 = (json_value)schema;
    local_2f8 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8);
    if (!bVar13) {
      pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_388);
      jStack_2e8.number_integer._0_4_ = 0x706f7270;
      jStack_2e8.number_integer._4_1_ = 0x65;
      jStack_2e8.number_integer._5_2_ = 0x7472;
      jStack_2e8.number_integer._7_1_ = 0x79;
      uStack_2e0 = 0x614e;
      uStack_2de = 0x6d;
      uStack_2dd = 0x7365;
      jStack_2f0 = (json_value)0xd;
      uStack_2db = 0;
      __l_04._M_len = 1;
      __l_04._M_array = (iterator)&local_2f8;
      local_2f8.object = (object_t *)&jStack_2e8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_198,__l_04,(allocator_type *)&local_b0);
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                (&local_1b0,
                 (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_270);
      anon_unknown.dwarf_5714b::schema::make
                ((schema *)local_1e8,pbVar16,local_280,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_198,&local_1b0);
      uVar8 = local_1e8._8_8_;
      uVar29 = local_1e8._0_8_;
      local_1e8._0_8_ = (reference)0x0;
      local_1e8._8_8_ = (root_schema *)0x0;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_288[1].content_check_._M_invoker;
      local_288[1].content_check_.super__Function_base._M_manager = (_Manager_type)uVar29;
      local_288[1].content_check_._M_invoker = (_Invoker_type)uVar8;
      if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5),
         (root_schema *)local_1e8._8_8_ != (root_schema *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
      }
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector(&local_1b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_198);
      if (local_2f8.object != (object_t *)&jStack_2e8) {
        operator_delete(local_2f8.object,
                        CONCAT17(jStack_2e8.number_integer._7_1_,
                                 CONCAT25(jStack_2e8.number_integer._5_2_,
                                          CONCAT14(jStack_2e8.number_integer._4_1_,
                                                   jStack_2e8.number_integer._0_4_))) + 1);
      }
      local_2f8 = local_388;
      jStack_2f0 = local_380;
      jStack_2e8.number_integer._0_4_ = (undefined4)uStack_378;
      jStack_2e8.number_integer._4_1_ = (undefined1)((uint7)uStack_378 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)((uint7)uStack_378 >> 0x28);
      jStack_2e8.number_integer._7_1_ = uStack_371;
      uStack_2e0 = (undefined2)uStack_370;
      uStack_2de = (undefined1)((uint7)uStack_370 >> 0x10);
      uStack_2dd = (undefined2)((uint7)uStack_370 >> 0x18);
      uStack_2db = (undefined1)((uint7)uStack_370 >> 0x28);
      uStack_2da = (undefined2)(CONCAT17(uStack_369,uStack_370) >> 0x30);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_198,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_2f8);
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      local_380 = (json_value)
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                  ::_M_find_tr<char[8],void>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                              *)(schema->m_value).object,(char (*) [8])"default");
      vVar12 = schema->m_type;
      uVar29 = 0x8000000000000000;
LAB_00121ca8:
      uStack_378 = 0;
      uStack_371 = 0;
      uStack_370 = (undefined7)uVar29;
      uStack_369 = (undefined1)((ulong)uVar29 >> 0x38);
      p_Stack_190 = (_Base_ptr)0x0;
      pbStack_188 = (pointer)0x0;
      local_180 = 0x8000000000000000;
      if (vVar12 == array) goto LAB_00121cfe;
      if (vVar12 == object) {
        p_Stack_190 = &(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
      }
      else {
        local_180 = 1;
      }
    }
    else {
      if (vVar12 != array) {
        local_380 = (json_value)0x0;
        uVar29 = 1;
        goto LAB_00121ca8;
      }
      sVar2 = ((schema->m_value).string)->_M_string_length;
      local_380 = (json_value)0x0;
      uStack_378 = (undefined7)sVar2;
      uStack_371 = (undefined1)(sVar2 >> 0x38);
      uStack_370 = 0;
      uStack_369 = 0x80;
LAB_00121cfe:
      local_180 = 0x8000000000000000;
      p_Stack_190 = (_Base_ptr)0x0;
      pbStack_188 = (((schema->m_value).array)->
                    super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
    }
    local_388 = (json_value)schema;
    local_198 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_198);
    this_01 = &(prVar14->loader_).super__Function_base._M_manager;
    _Var28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_06;
    if (!bVar13) {
      pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_388);
      anon_unknown.dwarf_5714b::schema::set_default_value((schema *)this_01,pbVar16);
      _Var28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_07;
    }
    *(_Manager_type **)&((_Function_base *)&(local_238->super_schema)._vptr_schema)->_M_functor =
         this_01;
    local_278 = local_288;
    goto LAB_0012255f;
  case 2:
    prVar14 = (root_schema *)operator_new(0xa0);
    *(undefined8 *)((long)&(prVar14->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(prVar14->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_0015a6d8;
    (prVar14->loader_)._M_invoker = (_Invoker_type)local_280;
    (prVar14->format_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar14->format_check_).super__Function_base._M_functor + 8) = 0;
    (prVar14->loader_).super__Function_base._M_manager =
         (_Manager_type)&PTR_make_for_default__0015a728;
    *(undefined1 *)&(prVar14->format_check_).super__Function_base._M_manager = 0;
    (prVar14->format_check_)._M_invoker = (_Invoker_type)0x0;
    (prVar14->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar14->content_check_).super__Function_base._M_functor + 8) = 0;
    *(undefined1 *)&(prVar14->content_check_).super__Function_base._M_manager = 0;
    local_240 = &(prVar14->root_).
                 super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
    (prVar14->content_check_)._M_invoker = (_Invoker_type)0x0;
    (prVar14->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (prVar14->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)&(prVar14->files_)._M_t._M_impl = 0;
    *(undefined8 *)&(prVar14->files_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    (prVar14->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (prVar14->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (prVar14->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    (prVar14->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    jStack_2f0 = (json_value)0x0;
    jStack_2e8.number_integer._0_4_ = 0;
    jStack_2e8.number_integer._4_1_ = 0;
    jStack_2e8.number_integer._5_2_ = 0;
    jStack_2e8.number_integer._7_1_ = 0;
    uStack_2e0 = 0;
    uStack_2de = 0;
    uStack_2dd = 0;
    uStack_2db = 0;
    uStack_2da = 0x8000;
    vVar12 = schema->m_type;
    local_278 = prVar14;
    if (vVar12 == object) {
      local_2f8 = (json_value)schema;
      jStack_2f0 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[9],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [9])"maxItems");
      vVar12 = schema->m_type;
LAB_0011ec86:
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = 0;
      aStack_358._8_8_ = 0x8000000000000000;
      if (vVar12 == object) {
        jStack_360.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        if (vVar12 == array) {
          psVar24 = (string_t *)(schema->m_value).array;
          goto LAB_0011ecbe;
        }
        aStack_358._8_8_ = 1;
      }
    }
    else {
      if (vVar12 != array) {
        uStack_2e0 = 1;
        uStack_2de = 0;
        uStack_2dd = 0;
        uStack_2db = 0;
        uStack_2da = 0;
        local_2f8 = (json_value)schema;
        goto LAB_0011ec86;
      }
      psVar24 = (schema->m_value).string;
      sVar2 = psVar24->_M_string_length;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
      local_2f8 = (json_value)schema;
LAB_0011ecbe:
      aStack_358._8_8_ = 0x8000000000000000;
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = psVar24->_M_string_length;
    }
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368);
    if (!bVar13) {
      pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2f8);
      local_368.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
                (pbVar16,&local_368.number_unsigned);
      *(undefined1 *)&(local_278->format_check_).super__Function_base._M_manager = 1;
      (local_278->format_check_)._M_invoker = (_Invoker_type)local_368;
      local_198 = local_2f8;
      pbStack_188 = (pointer)CONCAT17(jStack_2e8.number_integer._7_1_,
                                      CONCAT25(jStack_2e8.number_integer._5_2_,
                                               CONCAT14(jStack_2e8.number_integer._4_1_,
                                                        jStack_2e8.number_integer._0_4_)));
      p_Stack_190 = (_Base_ptr)jStack_2f0;
      local_180 = CONCAT26(uStack_2da,
                           CONCAT15(uStack_2db,CONCAT23(uStack_2dd,CONCAT12(uStack_2de,uStack_2e0)))
                          );
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_368,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_198);
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      jStack_2f0 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[9],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [9])"minItems");
      vVar12 = schema->m_type;
      uVar29 = 0x8000000000000000;
LAB_0011f084:
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      uStack_2e0 = (undefined2)uVar29;
      uStack_2da = (undefined2)((ulong)uVar29 >> 0x30);
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = 0;
      aStack_358._8_8_ = 0x8000000000000000;
      if (vVar12 == object) {
        jStack_360.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        if (vVar12 == array) {
          psVar24 = (string_t *)(schema->m_value).array;
          goto LAB_0011f0e1;
        }
        aStack_358._8_8_ = 1;
      }
    }
    else {
      if (vVar12 != array) {
        jStack_2f0 = (json_value)0x0;
        uVar29 = 1;
        goto LAB_0011f084;
      }
      psVar24 = (schema->m_value).string;
      sVar2 = psVar24->_M_string_length;
      jStack_2f0 = (json_value)0x0;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
      uStack_2e0 = 0;
      uStack_2da = 0x8000;
LAB_0011f0e1:
      aStack_358._8_8_ = 0x8000000000000000;
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = psVar24->_M_string_length;
    }
    uStack_2db = 0;
    uStack_2dd = 0;
    uStack_2de = 0;
    local_368 = (json_value)schema;
    local_2f8 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368);
    if (!bVar13) {
      pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2f8);
      local_368.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
                (pbVar16,&local_368.number_unsigned);
      (local_278->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\x01';
      ((json_value *)((long)&(local_278->content_check_).super__Function_base._M_functor + 8))->
      object = (object_t *)local_368;
      local_120.string = local_2f8.string;
      uStack_110 = CONCAT17(jStack_2e8.number_integer._7_1_,
                            CONCAT25(jStack_2e8.number_integer._5_2_,
                                     CONCAT14(jStack_2e8.number_integer._4_1_,
                                              jStack_2e8.number_integer._0_4_)));
      local_118 = (_Base_ptr)jStack_2f0;
      local_108 = CONCAT26(uStack_2da,
                           CONCAT15(uStack_2db,CONCAT23(uStack_2dd,CONCAT12(uStack_2de,uStack_2e0)))
                          );
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_368,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_120);
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      jStack_2f0 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[12],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [12])"uniqueItems");
      vVar12 = schema->m_type;
      uVar29 = 0x8000000000000000;
LAB_0011f6e7:
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      uStack_2e0 = (undefined2)uVar29;
      uStack_2da = (undefined2)((ulong)uVar29 >> 0x30);
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = 0;
      aStack_358._8_8_ = 0x8000000000000000;
      if (vVar12 == array) goto LAB_0011f74e;
      if (vVar12 == object) {
        jStack_360.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        aStack_358._8_8_ = 1;
      }
    }
    else {
      if (vVar12 != array) {
        jStack_2f0.object = (object_t *)0x0;
        uVar29 = 1;
        goto LAB_0011f6e7;
      }
      sVar2 = ((schema->m_value).string)->_M_string_length;
      jStack_2f0.object = (object_t *)0x0;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
      uStack_2e0 = 0;
      uStack_2da = 0x8000;
LAB_0011f74e:
      aStack_358._8_8_ = 0x8000000000000000;
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    uStack_2db = 0;
    uStack_2dd = 0;
    uStack_2de = 0;
    local_368 = (json_value)schema;
    local_2f8 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368);
    if (!bVar13) {
      pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2f8);
      local_368.number_unsigned = local_368.number_unsigned & 0xffffffffffffff00;
      nlohmann::json_abi_v3_11_2::detail::
      from_json<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (pbVar16,&local_368.boolean);
      *(boolean_t *)&(local_278->content_check_).super__Function_base._M_manager = local_368.boolean
      ;
      local_e0.string = local_2f8.string;
      uStack_d0 = CONCAT17(jStack_2e8.number_integer._7_1_,
                           CONCAT25(jStack_2e8.number_integer._5_2_,
                                    CONCAT14(jStack_2e8.number_integer._4_1_,
                                             jStack_2e8.number_integer._0_4_)));
      local_d8 = (_Base_ptr)jStack_2f0;
      local_c8 = CONCAT26(uStack_2da,
                          CONCAT15(uStack_2db,CONCAT23(uStack_2dd,CONCAT12(uStack_2de,uStack_2e0))))
      ;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_368,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_e0);
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      jStack_2f0 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[6],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [6])0x145204);
      vVar12 = schema->m_type;
      uVar29 = 0x8000000000000000;
LAB_0011fd4c:
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      uStack_2e0 = (undefined2)uVar29;
      uStack_2da = (undefined2)((ulong)uVar29 >> 0x30);
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = 0;
      aStack_358._8_8_ = 0x8000000000000000;
      if (vVar12 == array) goto LAB_0011fdb3;
      if (vVar12 == object) {
        jStack_360.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        aStack_358._8_8_ = 1;
      }
    }
    else {
      if (vVar12 != array) {
        jStack_2f0.object = (object_t *)0x0;
        uVar29 = 1;
        goto LAB_0011fd4c;
      }
      sVar2 = ((schema->m_value).string)->_M_string_length;
      jStack_2f0.object = (object_t *)0x0;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
      uStack_2e0 = 0;
      uStack_2da = 0x8000;
LAB_0011fdb3:
      aStack_358._8_8_ = 0x8000000000000000;
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    uStack_2db = 0;
    uStack_2dd = 0;
    uStack_2de = 0;
    local_368 = (json_value)schema;
    local_2f8 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368);
    if (!bVar13) {
      pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2f8);
      if (pbVar16->m_type == array) {
        local_388.object =
             (object_t *)
             nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)&local_2f8);
        local_380 = (json_value)0x0;
        uStack_378 = 0;
        uStack_371 = 0;
        uStack_370 = 0;
        uStack_369 = 0x80;
        vVar12 = *(value_t *)&((local_388.object)->_M_t)._M_impl;
        if (vVar12 == null) {
          uStack_370 = 1;
LAB_00121e75:
          uStack_369 = 0;
          p_Stack_260 = (_Base_ptr)0x0;
          pbStack_258 = (pointer)0x0;
          plStack_250 = (long *)0x1;
        }
        else if (vVar12 == array) {
          uVar29 = *(undefined8 *)
                    &(((json_value *)
                      &((local_388.array)->
                       super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish)->object->_M_t)._M_impl;
          uStack_378 = (undefined7)uVar29;
          uStack_371 = (undefined1)((ulong)uVar29 >> 0x38);
          p_Stack_260 = (_Base_ptr)0x0;
          plStack_250 = (long *)0x8000000000000000;
          pbStack_258 = (((json_value *)
                         &((local_388.array)->
                          super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish)->array->
                        super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          if (vVar12 != object) {
            uStack_370 = 0;
            goto LAB_00121e75;
          }
          local_380 = (json_value)
                      ((json_value *)&(local_388.string)->_M_string_length)->binary->m_subtype;
          pbStack_258 = (pointer)0x0;
          plStack_250 = (long *)0x8000000000000000;
          p_Stack_260 = &(((json_value *)
                          &((local_388.array)->
                           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish)->object->_M_t)._M_impl.
                         super__Rb_tree_header._M_header;
        }
        local_288 = (root_schema *)0x0;
        local_268.object = local_388.object;
        while (bVar13 = nlohmann::json_abi_v3_11_2::detail::
                        iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ::
                        operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                  ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)&local_388,
                                   (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)&local_268), !bVar13) {
          pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                    iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&local_388);
          local_368.object = (object_t *)&aStack_358;
          jStack_360.number_integer = 5;
          aStack_358._M_allocated_capacity._0_6_ = 0x736d657469;
          cVar33 = '\x01';
          if (9 < local_288) {
            prVar26 = local_288;
            cVar11 = '\x04';
            do {
              cVar33 = cVar11;
              if (prVar26 < 100) {
                cVar33 = cVar33 + -2;
                goto LAB_00121f5b;
              }
              if (prVar26 < 1000) {
                cVar33 = cVar33 + -1;
                goto LAB_00121f5b;
              }
              if (prVar26 < 10000) goto LAB_00121f5b;
              bVar13 = 99999 < prVar26;
              prVar26 = (root_schema *)((ulong)prVar26 / 10000);
              cVar11 = cVar33 + '\x04';
            } while (bVar13);
            cVar33 = cVar33 + '\x01';
          }
LAB_00121f5b:
          aStack_348._M_allocated_capacity = (size_type)local_338;
          std::__cxx11::string::_M_construct((ulong)&aStack_348,cVar33);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)aStack_348._M_allocated_capacity,aStack_348._8_4_,
                     (unsigned_long)local_288);
          __l_05._M_len = 2;
          __l_05._M_array = (iterator)&local_368;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_228,__l_05,(allocator_type *)local_208);
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_68,
                     (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_270);
          anon_unknown.dwarf_5714b::schema::make
                    ((schema *)(local_1e8 + 0x18),pbVar16,local_280,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_228,
                     (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_68);
          std::
          vector<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
          ::push_back((vector<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                       *)local_240,(value_type *)(local_1e8 + 0x18));
          if (local_1c8 != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8);
          }
          local_288 = (root_schema *)((long)local_288 + 1);
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_228);
          lVar35 = -0x40;
          plVar36 = local_338;
          do {
            if (plVar36 != (long *)plVar36[-2]) {
              operator_delete((long *)plVar36[-2],*plVar36 + 1);
            }
            plVar36 = plVar36 + -4;
            lVar35 = lVar35 + 0x20;
          } while (lVar35 != 0);
          vVar12 = *(value_t *)&((local_388.object)->_M_t)._M_impl;
          if (vVar12 == array) {
            lVar35 = CONCAT17(uStack_371,uStack_378) + 0x10;
            uStack_378 = (undefined7)lVar35;
            uStack_371 = (undefined1)((ulong)lVar35 >> 0x38);
          }
          else if (vVar12 == object) {
            local_380.string = (string_t *)std::_Rb_tree_increment(local_380.string);
          }
          else {
            lVar35 = CONCAT17(uStack_369,uStack_370) + 1;
            uStack_370 = (undefined7)lVar35;
            uStack_369 = (undefined1)((ulong)lVar35 >> 0x38);
          }
        }
        jStack_360.object = (object_t *)0x0;
        aStack_358._M_allocated_capacity = 0;
        aStack_358._8_8_ = 0x8000000000000000;
        vVar12 = schema->m_type;
        if (vVar12 == object) {
          local_368 = (json_value)schema;
          jStack_360 = (json_value)
                       std::
                       _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                       ::_M_find_tr<char[16],void>
                                 ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                   *)(schema->m_value).object,(char (*) [16])"additionalItems");
          vVar12 = schema->m_type;
LAB_001220f5:
          local_380.object = (object_t *)0x0;
          uStack_378 = 0;
          uStack_371 = 0;
          uStack_370 = 0;
          uStack_369 = 0x80;
          if (vVar12 == object) {
            local_380.object =
                 (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
          }
          else {
            if (vVar12 == array) {
              psVar24 = (schema->m_value).string;
              goto LAB_0012211b;
            }
            uStack_370 = 1;
            uStack_369 = 0;
          }
        }
        else {
          if (vVar12 != array) {
            aStack_358._8_8_ = 1;
            local_368 = (json_value)schema;
            goto LAB_001220f5;
          }
          psVar24 = (schema->m_value).string;
          aStack_358._M_allocated_capacity = psVar24->_M_string_length;
          local_368 = (json_value)schema;
LAB_0012211b:
          uStack_369 = 0x80;
          uStack_370 = 0;
          local_380.object = (object_t *)0x0;
          uStack_378 = (undefined7)psVar24->_M_string_length;
          uStack_371 = (undefined1)(psVar24->_M_string_length >> 0x38);
        }
        local_388 = (json_value)schema;
        bVar13 = nlohmann::json_abi_v3_11_2::detail::
                 iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::
                 operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                           ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_368,
                            (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_388);
        if (!bVar13) {
          pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                    iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&local_368);
          uStack_378 = 0x6f697469646461;
          uStack_371 = 0x6e;
          uStack_370 = 0x736d6574496c61;
          local_380 = (json_value)0xf;
          uStack_369 = 0;
          __l_06._M_len = 1;
          __l_06._M_array = (iterator)&local_388;
          local_388.object = (object_t *)&uStack_378;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_268,__l_06,(allocator_type *)local_208);
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)
                     (local_1e8 + 0x18),
                     (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_270);
          anon_unknown.dwarf_5714b::schema::make
                    ((schema *)&local_228,pbVar16,local_280,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_268,
                     (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)
                     (local_1e8 + 0x18));
          p_Var7 = p_Stack_220;
          jVar6 = local_228;
          local_228.object = (object_t *)0x0;
          p_Stack_220 = (_Base_ptr)0x0;
          this_04 = (local_278->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (local_278->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)jVar6;
          (local_278->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var7;
          if ((this_04 != (_Base_ptr)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_04),
             p_Stack_220 != (_Base_ptr)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Stack_220);
          }
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)
                     (local_1e8 + 0x18));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_268);
          if (local_388.object != (object_t *)&uStack_378) {
            operator_delete(local_388.object,CONCAT17(uStack_371,uStack_378) + 1);
          }
          local_388 = local_368;
          local_380 = jStack_360;
          uStack_378 = (undefined7)aStack_358._M_allocated_capacity;
          uStack_371 = (undefined1)((ulong)aStack_358._0_8_ >> 0x38);
          uStack_370 = (undefined7)aStack_358._8_8_;
          uStack_369 = (undefined1)((ulong)aStack_358._8_8_ >> 0x38);
          nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                    ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)&local_268,schema,
                     (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)&local_388);
        }
      }
      else {
        pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&local_2f8);
        if ((pbVar16->m_type == object) ||
           (pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                      iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)&local_2f8), pbVar16->m_type == boolean)) {
          pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                    iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&local_2f8);
          aStack_358._M_allocated_capacity._0_6_ = 0x736d657469;
          jStack_360.number_integer = 5;
          __l._M_len = 1;
          __l._M_array = (iterator)&local_368;
          local_368.object = (object_t *)&aStack_358;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_388,__l,(allocator_type *)&local_228.boolean);
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_68,
                     (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_270);
          anon_unknown.dwarf_5714b::schema::make
                    ((schema *)&local_268,pbVar16,local_280,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_388,
                     (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_68);
          p_Var7 = p_Stack_260;
          jVar6 = local_268;
          local_268.object = (object_t *)0x0;
          p_Stack_260 = (_Base_ptr)0x0;
          this_03 = (local_278->root_).
                    super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          (local_278->content_check_)._M_invoker = (_Invoker_type)jVar6;
          (local_278->root_).
          super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var7;
          if ((this_03 != (element_type *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03),
             p_Stack_260 != (_Base_ptr)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Stack_260);
          }
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_388);
          if (local_368.object != (object_t *)&aStack_358) {
            operator_delete(local_368.object,aStack_358._M_allocated_capacity + 1);
          }
        }
      }
      local_368 = local_2f8;
      aStack_358._M_allocated_capacity =
           CONCAT17(jStack_2e8.number_integer._7_1_,
                    CONCAT25(jStack_2e8.number_integer._5_2_,
                             CONCAT14(jStack_2e8.number_integer._4_1_,
                                      jStack_2e8.number_integer._0_4_)));
      jStack_360 = jStack_2f0;
      aStack_358._8_8_ =
           CONCAT26(uStack_2da,
                    CONCAT15(uStack_2db,CONCAT23(uStack_2dd,CONCAT12(uStack_2de,uStack_2e0))));
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_268,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_368);
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      jStack_2f0 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[9],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [9])"contains");
      vVar12 = schema->m_type;
      uVar29 = 0x8000000000000000;
LAB_0012235a:
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      uStack_2e0 = (undefined2)uVar29;
      uStack_2da = (undefined2)((ulong)uVar29 >> 0x30);
      p_Stack_260 = (_Base_ptr)0x0;
      pbStack_258 = (pointer)0x0;
      plStack_250 = (long *)0x8000000000000000;
      if (vVar12 == array) goto LAB_001223bc;
      if (vVar12 == object) {
        p_Stack_260 = &(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
      }
      else {
        plStack_250 = (long *)0x1;
      }
    }
    else {
      if (vVar12 != array) {
        jStack_2f0 = (json_value)0x0;
        uVar29 = 1;
        goto LAB_0012235a;
      }
      sVar2 = ((schema->m_value).string)->_M_string_length;
      jStack_2f0 = (json_value)0x0;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
      uStack_2e0 = 0;
      uStack_2da = 0x8000;
LAB_001223bc:
      plStack_250 = (long *)0x8000000000000000;
      p_Stack_260 = (_Base_ptr)0x0;
      pbStack_258 = (((schema->m_value).array)->
                    super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
    }
    uStack_2db = 0;
    uStack_2dd = 0;
    uStack_2de = 0;
    local_2f8 = (json_value)schema;
    local_268 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_268);
    _Var28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_09;
    if (!bVar13) {
      pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2f8);
      pbStack_258 = (pointer)0x736e6961746e6f63;
      p_Stack_260 = (_Base_ptr)0x8;
      plStack_250 = (long *)((ulong)plStack_250 & 0xffffffffffffff00);
      __l_07._M_len = 1;
      __l_07._M_array = (iterator)&local_268;
      local_268.object = (object_t *)&pbStack_258;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_228,__l_07,(allocator_type *)&local_1b0);
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_208,
                 (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_270);
      anon_unknown.dwarf_5714b::schema::make
                (&local_88,pbVar16,local_280,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_228,
                 (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_208);
      prVar26 = local_88.root_;
      pp_Var10 = local_88._vptr_schema;
      local_88._vptr_schema = (_func_int **)0x0;
      local_88.root_ = (root_schema *)0x0;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (local_278->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      (local_278->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)pp_Var10;
      (local_278->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)prVar26;
      if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5),
         local_88.root_ != (root_schema *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.root_);
      }
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_208);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_228);
      if (local_268.object != (object_t *)&pbStack_258) {
        operator_delete(local_268.object,(long)pbStack_258 + 1);
      }
      local_268 = local_2f8;
      pbStack_258 = (pointer)CONCAT17(jStack_2e8.number_integer._7_1_,
                                      CONCAT25(jStack_2e8.number_integer._5_2_,
                                               CONCAT14(jStack_2e8.number_integer._4_1_,
                                                        jStack_2e8.number_integer._0_4_)));
      p_Stack_260 = (_Base_ptr)jStack_2f0;
      plStack_250 = (long *)CONCAT26(uStack_2da,
                                     CONCAT15(uStack_2db,
                                              CONCAT23(uStack_2dd,CONCAT12(uStack_2de,uStack_2e0))))
      ;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_228,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_268);
      _Var28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_10;
    }
    *(_Manager_type **)&((_Function_base *)&(local_238->super_schema)._vptr_schema)->_M_functor =
         &(prVar14->loader_).super__Function_base._M_manager;
LAB_0012255f:
    (local_238->super_schema).root_ = local_278;
    this = local_238;
    goto LAB_00122563;
  case 3:
    prVar14 = (root_schema *)operator_new(0x108);
    *(undefined8 *)((long)&(prVar14->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(prVar14->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_0015a418;
    (prVar14->loader_)._M_invoker = (_Invoker_type)local_280;
    (prVar14->format_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar14->format_check_).super__Function_base._M_functor + 8) = 0;
    (prVar14->loader_).super__Function_base._M_manager =
         (_Manager_type)&PTR_make_for_default__0015a468;
    *(undefined1 *)&(prVar14->format_check_).super__Function_base._M_manager = 0;
    (prVar14->format_check_)._M_invoker = (_Invoker_type)0x0;
    (prVar14->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar14->content_check_).super__Function_base._M_functor + 8) = 0;
    local_368.number_integer._0_4_ = 0x10;
    std::locale::locale((locale *)&jStack_360.boolean);
    aStack_358._M_allocated_capacity = 0;
    aStack_358._8_8_ = 0;
    *(undefined1 *)&(prVar14->content_check_).super__Function_base._M_manager = 0;
    *(undefined4 *)&(prVar14->content_check_)._M_invoker = local_368.number_integer._0_4_;
    std::locale::locale((locale *)&prVar14->root_,(locale *)&jStack_360.boolean);
    uVar29 = aStack_358._8_8_;
    aStack_358._8_8_ = 0;
    (prVar14->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_358._M_allocated_capacity;
    *(undefined8 *)&(prVar14->files_)._M_t._M_impl = uVar29;
    aStack_358._M_allocated_capacity = 0;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_368);
    local_270 = (string *)&(prVar14->files_)._M_t._M_impl.super__Rb_tree_header;
    local_240 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                &(prVar14->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    *(__shared_count<(__gnu_cxx::_Lock_policy)2> **)
     &(prVar14->files_)._M_t._M_impl.super__Rb_tree_header._M_header = local_240;
    (prVar14->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    *(undefined1 *)&(prVar14->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = 0;
    *(undefined1 *)&(prVar14->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_288 = prVar14 + 1;
    local_278 = (root_schema *)&prVar14[1].loader_.super__Function_base._M_manager;
    *(root_schema **)&prVar14[1].loader_.super__Function_base._M_functor = local_278;
    *(undefined8 *)((long)&prVar14[1].loader_.super__Function_base._M_functor + 8) = 0;
    *(undefined1 *)&prVar14[1].loader_.super__Function_base._M_manager = 0;
    local_280 = (root_schema *)&prVar14[1].format_check_;
    std::_Tuple_impl<1ul,std::__cxx11::string,std::__cxx11::string>::
    _Tuple_impl<char_const(&)[1],char_const(&)[1],void>
              ((_Tuple_impl<1ul,std::__cxx11::string,std::__cxx11::string> *)local_280,
               (char (*) [1])0x1446fb,(char (*) [1])0x1446fb);
    *(undefined1 *)
     &prVar14[1].root_.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = 0;
    jStack_2f0 = (json_value)0x0;
    jStack_2e8.number_integer._0_4_ = 0;
    jStack_2e8.number_integer._4_1_ = 0;
    jStack_2e8.number_integer._5_2_ = 0;
    jStack_2e8.number_integer._7_1_ = 0;
    uStack_2e0 = 0;
    uStack_2de = 0;
    uStack_2dd = 0;
    uStack_2db = 0;
    uStack_2da = 0x8000;
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      local_2f8 = (json_value)schema;
      jStack_2f0 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[10],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [10])"maxLength");
      vVar12 = schema->m_type;
LAB_0011ed4f:
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = 0;
      aStack_358._8_8_ = 0x8000000000000000;
      if (vVar12 == object) {
        jStack_360.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        if (vVar12 == array) {
          psVar24 = (string_t *)(schema->m_value).array;
          goto LAB_0011ed87;
        }
        aStack_358._8_8_ = 1;
      }
    }
    else {
      if (vVar12 != array) {
        uStack_2e0 = 1;
        uStack_2de = 0;
        uStack_2dd = 0;
        uStack_2db = 0;
        uStack_2da = 0;
        local_2f8 = (json_value)schema;
        goto LAB_0011ed4f;
      }
      psVar24 = (schema->m_value).string;
      sVar2 = psVar24->_M_string_length;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
      local_2f8 = (json_value)schema;
LAB_0011ed87:
      aStack_358._8_8_ = 0x8000000000000000;
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = psVar24->_M_string_length;
    }
    local_368 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368);
    if (!bVar13) {
      pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2f8);
      local_368.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
                (pbVar16,&local_368.number_unsigned);
      *(undefined1 *)&(prVar14->format_check_).super__Function_base._M_manager = 1;
      (prVar14->format_check_)._M_invoker = (_Invoker_type)local_368;
      local_198 = local_2f8;
      pbStack_188 = (pointer)CONCAT17(jStack_2e8.number_integer._7_1_,
                                      CONCAT25(jStack_2e8.number_integer._5_2_,
                                               CONCAT14(jStack_2e8.number_integer._4_1_,
                                                        jStack_2e8.number_integer._0_4_)));
      p_Stack_190 = (_Base_ptr)jStack_2f0;
      local_180 = CONCAT26(uStack_2da,
                           CONCAT15(uStack_2db,CONCAT23(uStack_2dd,CONCAT12(uStack_2de,uStack_2e0)))
                          );
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_368,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_198);
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      jStack_2f0 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[10],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [10])"minLength");
      vVar12 = schema->m_type;
      uVar29 = 0x8000000000000000;
LAB_0011f37c:
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      uStack_2e0 = (undefined2)uVar29;
      uStack_2da = (undefined2)((ulong)uVar29 >> 0x30);
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = 0;
      aStack_358._8_8_ = 0x8000000000000000;
      if (vVar12 == object) {
        jStack_360.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        if (vVar12 == array) {
          psVar24 = (string_t *)(schema->m_value).array;
          goto LAB_0011f3d9;
        }
        aStack_358._8_8_ = 1;
      }
    }
    else {
      if (vVar12 != array) {
        jStack_2f0 = (json_value)0x0;
        uVar29 = 1;
        goto LAB_0011f37c;
      }
      psVar24 = (schema->m_value).string;
      sVar2 = psVar24->_M_string_length;
      jStack_2f0 = (json_value)0x0;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
      uStack_2e0 = 0;
      uStack_2da = 0x8000;
LAB_0011f3d9:
      aStack_358._8_8_ = 0x8000000000000000;
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = psVar24->_M_string_length;
    }
    uStack_2db = 0;
    uStack_2dd = 0;
    uStack_2de = 0;
    local_368 = (json_value)schema;
    local_2f8 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368);
    if (!bVar13) {
      pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2f8);
      local_368.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
                (pbVar16,&local_368.number_unsigned);
      (prVar14->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\x01';
      ((json_value *)((long)&(prVar14->content_check_).super__Function_base._M_functor + 8))->object
           = (object_t *)local_368;
      local_120.string = local_2f8.string;
      uStack_110 = CONCAT17(jStack_2e8.number_integer._7_1_,
                            CONCAT25(jStack_2e8.number_integer._5_2_,
                                     CONCAT14(jStack_2e8.number_integer._4_1_,
                                              jStack_2e8.number_integer._0_4_)));
      local_118 = (_Base_ptr)jStack_2f0;
      local_108 = CONCAT26(uStack_2da,
                           CONCAT15(uStack_2db,CONCAT23(uStack_2dd,CONCAT12(uStack_2de,uStack_2e0)))
                          );
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_368,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_120);
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      jStack_2f0 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[16],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [16])"contentEncoding");
      vVar12 = schema->m_type;
      uVar29 = 0x8000000000000000;
LAB_0011f9f3:
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      uStack_2e0 = (undefined2)uVar29;
      uStack_2da = (undefined2)((ulong)uVar29 >> 0x30);
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = 0;
      aStack_358._8_8_ = 0x8000000000000000;
      if (vVar12 == array) goto LAB_0011fa5a;
      if (vVar12 == object) {
        jStack_360.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        aStack_358._8_8_ = 1;
      }
    }
    else {
      if (vVar12 != array) {
        jStack_2f0.object = (object_t *)0x0;
        uVar29 = 1;
        goto LAB_0011f9f3;
      }
      sVar2 = ((schema->m_value).string)->_M_string_length;
      jStack_2f0.object = (object_t *)0x0;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
      uStack_2e0 = 0;
      uStack_2da = 0x8000;
LAB_0011fa5a:
      aStack_358._8_8_ = 0x8000000000000000;
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    uStack_2db = 0;
    uStack_2dd = 0;
    uStack_2de = 0;
    local_368 = (json_value)schema;
    local_2f8 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368);
    if (!bVar13) {
      *(undefined1 *)
       &prVar14[1].root_.
        super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 1;
      pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2f8);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_368,pbVar16);
      std::__cxx11::string::operator=
                ((string *)&prVar14[1].content_check_,(string *)&local_368.boolean);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368.object != &aStack_358) {
        operator_delete(local_368.object,(ulong)(aStack_358._M_allocated_capacity + 1));
      }
      local_e0 = local_2f8;
      uStack_d0 = CONCAT17(jStack_2e8.number_integer._7_1_,
                           CONCAT25(jStack_2e8.number_integer._5_2_,
                                    CONCAT14(jStack_2e8.number_integer._4_1_,
                                             jStack_2e8.number_integer._0_4_)));
      local_d8 = (_Base_ptr)jStack_2f0;
      local_c8 = CONCAT26(uStack_2da,
                          CONCAT15(uStack_2db,CONCAT23(uStack_2dd,CONCAT12(uStack_2de,uStack_2e0))))
      ;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_368,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_e0);
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      jStack_2f0 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[17],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [17])"contentMediaType");
      vVar12 = schema->m_type;
      uVar29 = 0x8000000000000000;
LAB_001200a6:
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      uStack_2e0 = (undefined2)uVar29;
      uStack_2da = (undefined2)((ulong)uVar29 >> 0x30);
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = 0;
      aStack_358._8_8_ = 0x8000000000000000;
      if (vVar12 == array) goto LAB_0012010d;
      if (vVar12 == object) {
        jStack_360.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        aStack_358._8_8_ = 1;
      }
    }
    else {
      if (vVar12 != array) {
        jStack_2f0.object = (object_t *)0x0;
        uVar29 = 1;
        goto LAB_001200a6;
      }
      sVar2 = ((schema->m_value).string)->_M_string_length;
      jStack_2f0.object = (object_t *)0x0;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
      uStack_2e0 = 0;
      uStack_2da = 0x8000;
LAB_0012010d:
      aStack_358._8_8_ = 0x8000000000000000;
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    uStack_2db = 0;
    uStack_2dd = 0;
    uStack_2de = 0;
    local_368 = (json_value)schema;
    local_2f8 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368);
    if (!bVar13) {
      *(undefined1 *)
       &prVar14[1].root_.
        super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 1;
      pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2f8);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_368,pbVar16);
      std::__cxx11::string::operator=((string *)local_280,(string *)&local_368.boolean);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368.object != &aStack_358) {
        operator_delete(local_368.object,(ulong)(aStack_358._M_allocated_capacity + 1));
      }
      local_388 = local_2f8;
      uStack_378 = CONCAT25(jStack_2e8.number_integer._5_2_,
                            CONCAT14(jStack_2e8.number_integer._4_1_,jStack_2e8.number_integer._0_4_
                                    ));
      local_380 = jStack_2f0;
      uStack_371 = jStack_2e8.number_integer._7_1_;
      uStack_370 = (undefined7)
                   CONCAT26(uStack_2da,
                            CONCAT15(uStack_2db,CONCAT23(uStack_2dd,CONCAT12(uStack_2de,uStack_2e0))
                                    ));
      uStack_369 = (undefined1)((ushort)uStack_2da >> 8);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_368,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_388);
    }
    if ((*(char *)&prVar14[1].root_.
                   super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr == '\x01') && (*(long *)((prVar14->loader_)._M_invoker + 0x50) == 0)) {
      piVar25 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar25,
                 "schema contains contentEncoding/contentMediaType but content checker was not set")
      ;
      __cxa_throw(piVar25,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      jStack_2f0 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[8],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [8])"pattern");
      vVar12 = schema->m_type;
      uVar29 = 0x8000000000000000;
LAB_00120a4e:
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      uStack_2e0 = (undefined2)uVar29;
      uStack_2da = (undefined2)((ulong)uVar29 >> 0x30);
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = 0;
      aStack_358._8_8_ = (pointer)0x8000000000000000;
      if (vVar12 == array) goto LAB_00120ab5;
      if (vVar12 == object) {
        jStack_360.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        aStack_358._8_8_ = (pointer)0x1;
      }
    }
    else {
      if (vVar12 != array) {
        jStack_2f0 = (json_value)0x0;
        uVar29 = 1;
        goto LAB_00120a4e;
      }
      sVar2 = ((schema->m_value).string)->_M_string_length;
      jStack_2f0 = (json_value)0x0;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
      uStack_2e0 = 0;
      uStack_2da = 0x8000;
LAB_00120ab5:
      aStack_358._8_8_ = (pointer)0x8000000000000000;
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    uStack_2db = 0;
    uStack_2dd = 0;
    uStack_2de = 0;
    local_368 = (json_value)schema;
    local_2f8 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368);
    if (!bVar13) {
      pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2f8);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_368,pbVar16);
      std::__cxx11::string::operator=(local_270,(string *)&local_368.boolean);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368.object != &aStack_358) {
        operator_delete(local_368.object,(ulong)(aStack_358._M_allocated_capacity + 1));
      }
      pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2f8);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_228,pbVar16);
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_268.boolean,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_228,
                 0x10);
      local_368.boolean = true;
      jStack_360.number_integer._0_4_ = local_268.number_integer._0_4_;
      std::locale::locale((locale *)aStack_358._M_local_buf,(locale *)&p_Stack_260);
      aStack_358._8_8_ = pbStack_258;
      aStack_348._M_allocated_capacity = (size_type)plStack_250;
      pbStack_258 = (pointer)0x0;
      plStack_250 = (long *)0x0;
      *(boolean_t *)&(prVar14->content_check_).super__Function_base._M_manager = local_368.boolean;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::operator=
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 &(prVar14->content_check_)._M_invoker,
                 (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&jStack_360);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&jStack_360);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_268);
      if ((json_value *)local_228.object != &local_218) {
        operator_delete(local_228.object,local_218.number_integer + 1);
      }
      local_268 = local_2f8;
      pbStack_258 = (pointer)CONCAT17(jStack_2e8.number_integer._7_1_,
                                      CONCAT25(jStack_2e8.number_integer._5_2_,
                                               CONCAT14(jStack_2e8.number_integer._4_1_,
                                                        jStack_2e8.number_integer._0_4_)));
      p_Stack_260 = (_Base_ptr)jStack_2f0;
      plStack_250 = (long *)CONCAT26(uStack_2da,
                                     CONCAT15(uStack_2db,
                                              CONCAT23(uStack_2dd,CONCAT12(uStack_2de,uStack_2e0))))
      ;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_368,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_268);
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      jStack_2f0 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[7],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [7])"format");
      vVar12 = schema->m_type;
      uVar29 = 0x8000000000000000;
LAB_00120d93:
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      uStack_2e0 = (undefined2)uVar29;
      uStack_2da = (undefined2)((ulong)uVar29 >> 0x30);
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity = 0;
      aStack_358._8_8_ = 0x8000000000000000;
      if (vVar12 == array) goto LAB_00120de9;
      if (vVar12 == object) {
        jStack_360.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        aStack_358._8_8_ = 1;
      }
    }
    else {
      if (vVar12 != array) {
        jStack_2f0.object = (object_t *)0x0;
        uVar29 = 1;
        goto LAB_00120d93;
      }
      sVar2 = ((schema->m_value).string)->_M_string_length;
      jStack_2f0.object = (object_t *)0x0;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
      uStack_2e0 = 0;
      uStack_2da = 0x8000;
LAB_00120de9:
      aStack_358._8_8_ = 0x8000000000000000;
      jStack_360.object = (object_t *)0x0;
      aStack_358._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    uStack_2db = 0;
    uStack_2dd = 0;
    uStack_2de = 0;
    local_368 = (json_value)schema;
    local_2f8 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368);
    _Var28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_02;
    if (!bVar13) {
      if (*(long *)((prVar14->loader_)._M_invoker + 0x30) == 0) {
        piVar25 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_368,
                       "a format checker was not provided but a format keyword for this string is present: "
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_288);
        std::invalid_argument::invalid_argument(piVar25,(string *)&local_368.boolean);
        __cxa_throw(piVar25,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      pbVar16 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2f8);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_228,pbVar16);
      local_368.boolean = true;
      if (local_228.object == (object_t *)&local_218) {
        aStack_348._M_allocated_capacity = (size_type)plStack_210;
        jStack_360.object = (object_t *)(aStack_358._M_local_buf + 8);
      }
      else {
        jStack_360.string = local_228.string;
      }
      aStack_358._8_8_ = local_218;
      aStack_358._M_allocated_capacity = (size_type)p_Stack_220;
      p_Stack_220 = (_Base_ptr)0x0;
      local_218.number_unsigned = local_218.number_unsigned & 0xffffffffffffff00;
      *(undefined1 *)&(prVar14->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 1;
      local_228.object = (object_t *)&local_218;
      std::__cxx11::string::operator=((string *)local_288,(string *)&jStack_360.boolean);
      if (jStack_360.object != (object_t *)(aStack_358._M_local_buf + 8)) {
        operator_delete(jStack_360.object,aStack_358._8_8_ + 1);
      }
      if (local_228.object != (object_t *)&local_218) {
        operator_delete(local_228.object,local_218.number_integer + 1);
      }
      local_368 = local_2f8;
      aStack_358._M_allocated_capacity =
           CONCAT17(jStack_2e8.number_integer._7_1_,
                    CONCAT25(jStack_2e8.number_integer._5_2_,
                             CONCAT14(jStack_2e8.number_integer._4_1_,
                                      jStack_2e8.number_integer._0_4_)));
      jStack_360 = jStack_2f0;
      aStack_358._8_8_ =
           CONCAT26(uStack_2da,
                    CONCAT15(uStack_2db,CONCAT23(uStack_2dd,CONCAT12(uStack_2de,uStack_2e0))));
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_228,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_368);
      _Var28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_08;
    }
    *(_Manager_type **)&((_Function_base *)&(local_238->super_schema)._vptr_schema)->_M_functor =
         &(prVar14->loader_).super__Function_base._M_manager;
    (local_238->super_schema).root_ = prVar14;
    this = local_238;
    goto LAB_00122563;
  case 4:
    this = (type_schema *)operator_new(0x30);
    (this->super_schema).root_ = (root_schema *)0x100000001;
    *(undefined ***)&((_Function_base *)&(this->super_schema)._vptr_schema)->_M_functor =
         &PTR___Sp_counted_ptr_inplace_0015a4b8;
    (this->super_schema).default_value_.m_value.object = (object_t *)local_280;
    (((format_checker *)&this->type_)->super__Function_base)._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(((format_checker *)&this->type_)->super__Function_base)._M_functor + 8)
         = 0;
    ppuVar27 = &PTR_make_for_default__0015a508;
    break;
  case 5:
  case 6:
    prVar14 = (root_schema *)operator_new(0x68);
    *(undefined8 *)((long)&(prVar14->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(prVar14->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_0015a2d8;
    (prVar14->loader_)._M_invoker = (_Invoker_type)local_280;
    (prVar14->format_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar14->format_check_).super__Function_base._M_functor + 8) = 0;
    (prVar14->loader_).super__Function_base._M_manager =
         (_Manager_type)&PTR_make_for_default__0015a328;
    *(undefined1 *)&(prVar14->format_check_).super__Function_base._M_manager = 0;
    (prVar14->format_check_)._M_invoker = (_Invoker_type)0x0;
    (prVar14->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar14->content_check_).super__Function_base._M_functor + 8) = 0;
    *(undefined2 *)&(prVar14->content_check_).super__Function_base._M_manager = 0;
    *(undefined1 *)&(prVar14->content_check_)._M_invoker = 0;
    (prVar14->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    jStack_360.object = (object_t *)0x0;
    aStack_358._M_allocated_capacity = 0;
    aStack_358._8_8_ = 0x8000000000000000;
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      jStack_360 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[8],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [8])"maximum");
      vVar12 = schema->m_type;
LAB_0011e3f6:
      jStack_2f0 = (json_value)0x0;
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      uStack_2e0 = 0;
      uStack_2da = 0x8000;
      if (vVar12 == object) {
        jStack_2f0.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        if (vVar12 == array) {
          psVar24 = (schema->m_value).string;
          goto LAB_0011e42f;
        }
        uStack_2e0 = 1;
        uStack_2da = 0;
      }
    }
    else {
      if (vVar12 != array) {
        aStack_358._8_8_ = 1;
        goto LAB_0011e3f6;
      }
      psVar24 = (schema->m_value).string;
      aStack_358._M_allocated_capacity = psVar24->_M_string_length;
LAB_0011e42f:
      uStack_2da = 0x8000;
      uStack_2e0 = 0;
      jStack_2f0 = (json_value)0x0;
      sVar2 = psVar24->_M_string_length;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
    }
    uStack_2db = 0;
    uStack_2dd = 0;
    uStack_2de = 0;
    local_2f8 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368,
                        (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8);
    if (!bVar13) {
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_368);
      local_2f8.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long,_0>
                (pbVar15,&local_2f8.number_integer);
      *(undefined1 *)&(prVar14->format_check_).super__Function_base._M_manager = 1;
      (prVar14->format_check_)._M_invoker = (_Invoker_type)local_2f8;
      jStack_2e8.number_integer._0_4_ = 0x6978616d;
      jStack_2e8.number_integer._4_1_ = 0x6d;
      jStack_2e8.number_integer._5_2_ = 0x6d75;
      jStack_2f0 = (json_value)0x7;
      jStack_2e8.number_integer._7_1_ = 0;
      local_2f8.object = (object_t *)&jStack_2e8;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2f8);
      if (local_2f8.object != (object_t *)&jStack_2e8) {
        operator_delete(local_2f8.object,
                        CONCAT17(jStack_2e8.number_integer._7_1_,
                                 CONCAT25(jStack_2e8.number_integer._5_2_,
                                          CONCAT14(jStack_2e8.number_integer._4_1_,
                                                   jStack_2e8.number_integer._0_4_))) + 1);
      }
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      jStack_360 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[8],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [8])"minimum");
      vVar12 = schema->m_type;
      aStack_358._8_8_ = 0x8000000000000000;
LAB_0011e581:
      aStack_358._M_allocated_capacity = 0;
      jStack_2f0 = (json_value)0x0;
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      uStack_2e0 = 0;
      uStack_2da = 0x8000;
      if (vVar12 == object) {
        jStack_2f0.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        if (vVar12 == array) {
          psVar24 = (schema->m_value).string;
          goto LAB_0011e5d3;
        }
        uStack_2e0 = 1;
        uStack_2da = 0;
      }
    }
    else {
      if (vVar12 != array) {
        jStack_360.object = (object_t *)0x0;
        aStack_358._8_8_ = 1;
        goto LAB_0011e581;
      }
      psVar24 = (schema->m_value).string;
      aStack_358._M_allocated_capacity = psVar24->_M_string_length;
      jStack_360.object = (object_t *)0x0;
      aStack_358._8_8_ = 0x8000000000000000;
LAB_0011e5d3:
      uStack_2da = 0x8000;
      uStack_2e0 = 0;
      jStack_2f0 = (json_value)0x0;
      sVar2 = psVar24->_M_string_length;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
    }
    uStack_2db = 0;
    uStack_2dd = 0;
    uStack_2de = 0;
    local_368 = (json_value)schema;
    local_2f8 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368,
                        (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8);
    if (!bVar13) {
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_368);
      local_2f8.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long,_0>
                (pbVar15,&local_2f8.number_integer);
      (prVar14->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\x01';
      ((json_value *)((long)&(prVar14->content_check_).super__Function_base._M_functor + 8))->object
           = (object_t *)local_2f8;
      jStack_2e8.number_integer._0_4_ = 0x696e696d;
      jStack_2e8.number_integer._4_1_ = 0x6d;
      jStack_2e8.number_integer._5_2_ = 0x6d75;
      jStack_2f0 = (json_value)0x7;
      jStack_2e8.number_integer._7_1_ = 0;
      local_2f8.object = (object_t *)&jStack_2e8;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2f8);
      if (local_2f8.object != (object_t *)&jStack_2e8) {
        operator_delete(local_2f8.object,
                        CONCAT17(jStack_2e8.number_integer._7_1_,
                                 CONCAT25(jStack_2e8.number_integer._5_2_,
                                          CONCAT14(jStack_2e8.number_integer._4_1_,
                                                   jStack_2e8.number_integer._0_4_))) + 1);
      }
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      jStack_360 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[17],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [17])"exclusiveMaximum");
      vVar12 = schema->m_type;
      aStack_358._8_8_ = 0x8000000000000000;
LAB_0011e725:
      aStack_358._M_allocated_capacity = 0;
      jStack_2f0.object = (object_t *)0x0;
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      uStack_2e0 = 0;
      uStack_2da = 0x8000;
      if (vVar12 == array) goto LAB_0011e785;
      if (vVar12 == object) {
        jStack_2f0.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        uStack_2e0 = 1;
        uStack_2da = 0;
      }
    }
    else {
      if (vVar12 != array) {
        jStack_360.object = (object_t *)0x0;
        aStack_358._8_8_ = 1;
        goto LAB_0011e725;
      }
      aStack_358._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      jStack_360.object = (object_t *)0x0;
      aStack_358._8_8_ = 0x8000000000000000;
LAB_0011e785:
      uStack_2da = 0x8000;
      uStack_2e0 = 0;
      jStack_2f0.object = (object_t *)0x0;
      sVar2 = ((schema->m_value).string)->_M_string_length;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
    }
    uStack_2db = 0;
    uStack_2dd = 0;
    uStack_2de = 0;
    local_368 = (json_value)schema;
    local_2f8 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368,
                        (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8);
    if (!bVar13) {
      *(undefined1 *)&(prVar14->content_check_).super__Function_base._M_manager = 1;
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_368);
      local_2f8.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long,_0>
                (pbVar15,&local_2f8.number_integer);
      *(undefined1 *)&(prVar14->format_check_).super__Function_base._M_manager = 1;
      (prVar14->format_check_)._M_invoker = (_Invoker_type)local_2f8;
      local_198.number_integer = 0x10;
      local_2f8.object = (object_t *)&jStack_2e8;
      local_2f8.object =
           (object_t *)std::__cxx11::string::_M_create(&local_2f8.number_unsigned,(ulong)&local_198)
      ;
      jStack_2e8.number_integer._0_4_ = (undefined4)local_198.number_integer;
      jStack_2e8.number_integer._4_1_ = (undefined1)((ulong)local_198 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)((ulong)local_198 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)((ulong)local_198 >> 0x38);
      *(undefined8 *)
       &(local_2f8.array)->
        super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           = 0x766973756c637865;
      ((json_value *)
      &(local_2f8.array)->
       super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      )[1] = (json_value)0x6d756d6978614d65;
      jStack_2f0.string = local_198.string;
      *(undefined1 *)((long)&(local_2f8.object)->_M_t + (long)local_198.object) = 0;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2f8);
      if (local_2f8.object != (object_t *)&jStack_2e8) {
        operator_delete(local_2f8.object,
                        CONCAT17(jStack_2e8.number_integer._7_1_,
                                 CONCAT25(jStack_2e8.number_integer._5_2_,
                                          CONCAT14(jStack_2e8.number_integer._4_1_,
                                                   jStack_2e8.number_integer._0_4_))) + 1);
      }
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      jStack_360 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[17],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [17])"exclusiveMinimum");
      vVar12 = schema->m_type;
      aStack_358._8_8_ = 0x8000000000000000;
LAB_0011e8f1:
      aStack_358._M_allocated_capacity = 0;
      jStack_2f0.object = (object_t *)0x0;
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      uStack_2e0 = 0;
      uStack_2da = 0x8000;
      if (vVar12 == array) goto LAB_0011e951;
      if (vVar12 == object) {
        jStack_2f0.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        uStack_2e0 = 1;
        uStack_2da = 0;
      }
    }
    else {
      if (vVar12 != array) {
        jStack_360.object = (object_t *)0x0;
        aStack_358._8_8_ = 1;
        goto LAB_0011e8f1;
      }
      aStack_358._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      jStack_360.object = (object_t *)0x0;
      aStack_358._8_8_ = 0x8000000000000000;
LAB_0011e951:
      uStack_2da = 0x8000;
      uStack_2e0 = 0;
      jStack_2f0.object = (object_t *)0x0;
      sVar2 = ((schema->m_value).string)->_M_string_length;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
    }
    uStack_2db = 0;
    uStack_2dd = 0;
    uStack_2de = 0;
    local_368 = (json_value)schema;
    local_2f8 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368,
                        (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8);
    if (!bVar13) {
      *(undefined1 *)((long)&(prVar14->content_check_).super__Function_base._M_manager + 1) = 1;
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_368);
      local_2f8.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long,_0>
                (pbVar15,&local_2f8.number_integer);
      (prVar14->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\x01';
      ((json_value *)((long)&(prVar14->content_check_).super__Function_base._M_functor + 8))->object
           = (object_t *)local_2f8;
      local_198.number_integer = 0x10;
      local_2f8.object = (object_t *)&jStack_2e8;
      local_2f8.object =
           (object_t *)std::__cxx11::string::_M_create(&local_2f8.number_unsigned,(ulong)&local_198)
      ;
      jStack_2e8.number_integer._0_4_ = (undefined4)local_198.number_integer;
      jStack_2e8.number_integer._4_1_ = (undefined1)((ulong)local_198 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)((ulong)local_198 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)((ulong)local_198 >> 0x38);
      *(undefined8 *)
       &(local_2f8.array)->
        super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           = 0x766973756c637865;
      ((json_value *)
      &(local_2f8.array)->
       super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      )[1] = (json_value)0x6d756d696e694d65;
      jStack_2f0.string = local_198.string;
      *(undefined1 *)((long)&(local_2f8.object)->_M_t + (long)local_198.object) = 0;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2f8);
      if (local_2f8.object != (object_t *)&jStack_2e8) {
        operator_delete(local_2f8.object,
                        CONCAT17(jStack_2e8.number_integer._7_1_,
                                 CONCAT25(jStack_2e8.number_integer._5_2_,
                                          CONCAT14(jStack_2e8.number_integer._4_1_,
                                                   jStack_2e8.number_integer._0_4_))) + 1);
      }
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      jStack_360 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[11],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [11])"multipleOf");
      vVar12 = schema->m_type;
      aStack_358._8_8_ = 0x8000000000000000;
LAB_0011eaae:
      aStack_358._M_allocated_capacity = 0;
      jStack_2f0 = (json_value)0x0;
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      uStack_2e0 = 0;
      uStack_2da = 0x8000;
      if (vVar12 == array) goto LAB_0011eb04;
      if (vVar12 == object) {
        jStack_2f0.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        uStack_2e0 = 1;
        uStack_2da = 0;
      }
    }
    else {
      if (vVar12 != array) {
        jStack_360.object = (object_t *)0x0;
        aStack_358._8_8_ = 1;
        goto LAB_0011eaae;
      }
      aStack_358._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      jStack_360.object = (object_t *)0x0;
      aStack_358._8_8_ = 0x8000000000000000;
LAB_0011eb04:
      uStack_2da = 0x8000;
      uStack_2e0 = 0;
      jStack_2f0 = (json_value)0x0;
      sVar2 = ((schema->m_value).string)->_M_string_length;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
    }
    uStack_2db = 0;
    uStack_2dd = 0;
    uStack_2de = 0;
    local_368 = (json_value)schema;
    local_2f8 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368,
                        (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8);
    _Var28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
    if (!bVar13) {
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_368);
      local_2f8.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                (pbVar15,&local_2f8.number_float);
      *(undefined1 *)&(prVar14->content_check_)._M_invoker = 1;
      (prVar14->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_2f8;
      jStack_2e8.number_integer._0_4_ = 0x746c756d;
      jStack_2e8.number_integer._4_1_ = 0x69;
      jStack_2e8.number_integer._5_2_ = 0x6c70;
      jStack_2e8.number_integer._7_1_ = 0x65;
      uStack_2e0 = 0x664f;
      jStack_2f0 = (json_value)0xa;
      uStack_2de = 0;
      local_2f8.object = (object_t *)&jStack_2e8;
      pVar39 = std::
               _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::_M_insert_unique<std::__cxx11::string>
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_2f8);
      _Var28._M_pi = pVar39._8_8_;
LAB_00120b5e:
      if ((json_value *)local_2f8.object != &jStack_2e8) {
        operator_delete(local_2f8.object,
                        CONCAT17(jStack_2e8.number_integer._7_1_,
                                 CONCAT25(jStack_2e8.number_integer._5_2_,
                                          CONCAT14(jStack_2e8.number_integer._4_1_,
                                                   jStack_2e8.number_integer._0_4_))) + 1);
        _Var28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_01;
      }
    }
    goto LAB_00120b7b;
  case 7:
    prVar14 = (root_schema *)operator_new(0x68);
    *(undefined8 *)((long)&(prVar14->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(prVar14->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_0015a378;
    (prVar14->loader_)._M_invoker = (_Invoker_type)local_280;
    (prVar14->format_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar14->format_check_).super__Function_base._M_functor + 8) = 0;
    (prVar14->loader_).super__Function_base._M_manager =
         (_Manager_type)&PTR_make_for_default__0015a3c8;
    *(undefined1 *)&(prVar14->format_check_).super__Function_base._M_manager = 0;
    (prVar14->format_check_)._M_invoker = (_Invoker_type)0x0;
    (prVar14->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar14->content_check_).super__Function_base._M_functor + 8) = 0;
    *(undefined2 *)&(prVar14->content_check_).super__Function_base._M_manager = 0;
    *(undefined1 *)&(prVar14->content_check_)._M_invoker = 0;
    (prVar14->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    jStack_360.object = (object_t *)0x0;
    aStack_358._M_allocated_capacity = 0;
    aStack_358._8_8_ = 0x8000000000000000;
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      jStack_360 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[8],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [8])"maximum");
      vVar12 = schema->m_type;
LAB_0011ec24:
      jStack_2f0 = (json_value)0x0;
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      uStack_2e0 = 0;
      uStack_2da = 0x8000;
      if (vVar12 == object) {
        jStack_2f0.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        if (vVar12 == array) {
          psVar24 = (schema->m_value).string;
          goto LAB_0011ec65;
        }
        uStack_2e0 = 1;
        uStack_2da = 0;
      }
    }
    else {
      if (vVar12 != array) {
        aStack_358._8_8_ = 1;
        goto LAB_0011ec24;
      }
      psVar24 = (schema->m_value).string;
      aStack_358._M_allocated_capacity = psVar24->_M_string_length;
LAB_0011ec65:
      uStack_2da = 0x8000;
      uStack_2e0 = 0;
      jStack_2f0 = (json_value)0x0;
      sVar2 = psVar24->_M_string_length;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
    }
    uStack_2db = 0;
    uStack_2dd = 0;
    uStack_2de = 0;
    local_2f8 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368,
                        (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8);
    if (!bVar13) {
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_368);
      local_2f8.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                (pbVar15,&local_2f8.number_float);
      *(undefined1 *)&(prVar14->format_check_).super__Function_base._M_manager = 1;
      (prVar14->format_check_)._M_invoker = (_Invoker_type)local_2f8;
      jStack_2e8.number_integer._0_4_ = 0x6978616d;
      jStack_2e8.number_integer._4_1_ = 0x6d;
      jStack_2e8.number_integer._5_2_ = 0x6d75;
      jStack_2f0 = (json_value)0x7;
      jStack_2e8.number_integer._7_1_ = 0;
      local_2f8.object = (object_t *)&jStack_2e8;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2f8);
      if (local_2f8.object != (object_t *)&jStack_2e8) {
        operator_delete(local_2f8.object,
                        CONCAT17(jStack_2e8.number_integer._7_1_,
                                 CONCAT25(jStack_2e8.number_integer._5_2_,
                                          CONCAT14(jStack_2e8.number_integer._4_1_,
                                                   jStack_2e8.number_integer._0_4_))) + 1);
      }
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      jStack_360 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[8],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [8])"minimum");
      vVar12 = schema->m_type;
      aStack_358._8_8_ = 0x8000000000000000;
LAB_0011ef09:
      aStack_358._M_allocated_capacity = 0;
      jStack_2f0 = (json_value)0x0;
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      uStack_2e0 = 0;
      uStack_2da = 0x8000;
      if (vVar12 == object) {
        jStack_2f0.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        if (vVar12 == array) {
          psVar24 = (schema->m_value).string;
          goto LAB_0011ef63;
        }
        uStack_2e0 = 1;
        uStack_2da = 0;
      }
    }
    else {
      if (vVar12 != array) {
        jStack_360.object = (object_t *)0x0;
        aStack_358._8_8_ = 1;
        goto LAB_0011ef09;
      }
      psVar24 = (schema->m_value).string;
      aStack_358._M_allocated_capacity = psVar24->_M_string_length;
      jStack_360.object = (object_t *)0x0;
      aStack_358._8_8_ = 0x8000000000000000;
LAB_0011ef63:
      uStack_2da = 0x8000;
      uStack_2e0 = 0;
      jStack_2f0 = (json_value)0x0;
      sVar2 = psVar24->_M_string_length;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
    }
    uStack_2db = 0;
    uStack_2dd = 0;
    uStack_2de = 0;
    local_368 = (json_value)schema;
    local_2f8 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368,
                        (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8);
    if (!bVar13) {
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_368);
      local_2f8.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                (pbVar15,&local_2f8.number_float);
      (prVar14->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\x01';
      ((json_value *)((long)&(prVar14->content_check_).super__Function_base._M_functor + 8))->object
           = (object_t *)local_2f8;
      jStack_2e8.number_integer._0_4_ = 0x696e696d;
      jStack_2e8.number_integer._4_1_ = 0x6d;
      jStack_2e8.number_integer._5_2_ = 0x6d75;
      jStack_2f0 = (json_value)0x7;
      jStack_2e8.number_integer._7_1_ = 0;
      local_2f8.object = (object_t *)&jStack_2e8;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2f8);
      if (local_2f8.object != (object_t *)&jStack_2e8) {
        operator_delete(local_2f8.object,
                        CONCAT17(jStack_2e8.number_integer._7_1_,
                                 CONCAT25(jStack_2e8.number_integer._5_2_,
                                          CONCAT14(jStack_2e8.number_integer._4_1_,
                                                   jStack_2e8.number_integer._0_4_))) + 1);
      }
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      jStack_360 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[17],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [17])"exclusiveMaximum");
      vVar12 = schema->m_type;
      aStack_358._8_8_ = 0x8000000000000000;
LAB_0011f55b:
      aStack_358._M_allocated_capacity = 0;
      jStack_2f0.object = (object_t *)0x0;
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      uStack_2e0 = 0;
      uStack_2da = 0x8000;
      if (vVar12 == array) goto LAB_0011f5c2;
      if (vVar12 == object) {
        jStack_2f0.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        uStack_2e0 = 1;
        uStack_2da = 0;
      }
    }
    else {
      if (vVar12 != array) {
        jStack_360.object = (object_t *)0x0;
        aStack_358._8_8_ = 1;
        goto LAB_0011f55b;
      }
      aStack_358._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      jStack_360.object = (object_t *)0x0;
      aStack_358._8_8_ = 0x8000000000000000;
LAB_0011f5c2:
      uStack_2da = 0x8000;
      uStack_2e0 = 0;
      jStack_2f0.object = (object_t *)0x0;
      sVar2 = ((schema->m_value).string)->_M_string_length;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
    }
    uStack_2db = 0;
    uStack_2dd = 0;
    uStack_2de = 0;
    local_368 = (json_value)schema;
    local_2f8 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368,
                        (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8);
    if (!bVar13) {
      *(undefined1 *)&(prVar14->content_check_).super__Function_base._M_manager = 1;
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_368);
      local_2f8.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                (pbVar15,&local_2f8.number_float);
      *(undefined1 *)&(prVar14->format_check_).super__Function_base._M_manager = 1;
      (prVar14->format_check_)._M_invoker = (_Invoker_type)local_2f8;
      local_198.number_integer = 0x10;
      local_2f8.object = (object_t *)&jStack_2e8;
      local_2f8.object =
           (object_t *)std::__cxx11::string::_M_create(&local_2f8.number_unsigned,(ulong)&local_198)
      ;
      jStack_2e8.number_integer._0_4_ = (undefined4)local_198.number_integer;
      jStack_2e8.number_integer._4_1_ = (undefined1)((ulong)local_198 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)((ulong)local_198 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)((ulong)local_198 >> 0x38);
      *(undefined8 *)
       &(local_2f8.array)->
        super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           = 0x766973756c637865;
      ((json_value *)
      &(local_2f8.array)->
       super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      )[1] = (json_value)0x6d756d6978614d65;
      jStack_2f0.string = local_198.string;
      *(undefined1 *)((long)&(local_2f8.object)->_M_t + (long)local_198.object) = 0;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2f8);
      if (local_2f8.object != (object_t *)&jStack_2e8) {
        operator_delete(local_2f8.object,
                        CONCAT17(jStack_2e8.number_integer._7_1_,
                                 CONCAT25(jStack_2e8.number_integer._5_2_,
                                          CONCAT14(jStack_2e8.number_integer._4_1_,
                                                   jStack_2e8.number_integer._0_4_))) + 1);
      }
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      jStack_360 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[17],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [17])"exclusiveMinimum");
      vVar12 = schema->m_type;
      aStack_358._8_8_ = 0x8000000000000000;
LAB_0011fbca:
      aStack_358._M_allocated_capacity = 0;
      jStack_2f0.object = (object_t *)0x0;
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      uStack_2e0 = 0;
      uStack_2da = 0x8000;
      if (vVar12 == array) goto LAB_0011fc31;
      if (vVar12 == object) {
        jStack_2f0.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        uStack_2e0 = 1;
        uStack_2da = 0;
      }
    }
    else {
      if (vVar12 != array) {
        jStack_360.object = (object_t *)0x0;
        aStack_358._8_8_ = 1;
        goto LAB_0011fbca;
      }
      aStack_358._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      jStack_360.object = (object_t *)0x0;
      aStack_358._8_8_ = 0x8000000000000000;
LAB_0011fc31:
      uStack_2da = 0x8000;
      uStack_2e0 = 0;
      jStack_2f0.object = (object_t *)0x0;
      sVar2 = ((schema->m_value).string)->_M_string_length;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
    }
    uStack_2db = 0;
    uStack_2dd = 0;
    uStack_2de = 0;
    local_368 = (json_value)schema;
    local_2f8 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368,
                        (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8);
    if (!bVar13) {
      *(undefined1 *)((long)&(prVar14->content_check_).super__Function_base._M_manager + 1) = 1;
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_368);
      local_2f8.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                (pbVar15,&local_2f8.number_float);
      (prVar14->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\x01';
      ((json_value *)((long)&(prVar14->content_check_).super__Function_base._M_functor + 8))->object
           = (object_t *)local_2f8;
      local_198.number_integer = 0x10;
      local_2f8.object = (object_t *)&jStack_2e8;
      local_2f8.object =
           (object_t *)std::__cxx11::string::_M_create(&local_2f8.number_unsigned,(ulong)&local_198)
      ;
      jStack_2e8.number_integer._0_4_ = (undefined4)local_198.number_integer;
      jStack_2e8.number_integer._4_1_ = (undefined1)((ulong)local_198 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)((ulong)local_198 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)((ulong)local_198 >> 0x38);
      *(undefined8 *)
       &(local_2f8.array)->
        super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           = 0x766973756c637865;
      ((json_value *)
      &(local_2f8.array)->
       super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      )[1] = (json_value)0x6d756d696e694d65;
      jStack_2f0.string = local_198.string;
      *(undefined1 *)((long)&(local_2f8.object)->_M_t + (long)local_198.object) = 0;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2f8);
      if (local_2f8.object != (object_t *)&jStack_2e8) {
        operator_delete(local_2f8.object,
                        CONCAT17(jStack_2e8.number_integer._7_1_,
                                 CONCAT25(jStack_2e8.number_integer._5_2_,
                                          CONCAT14(jStack_2e8.number_integer._4_1_,
                                                   jStack_2e8.number_integer._0_4_))) + 1);
      }
    }
    vVar12 = schema->m_type;
    if (vVar12 == object) {
      jStack_360 = (json_value)
                   std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_find_tr<char[11],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(schema->m_value).object,(char (*) [11])"multipleOf");
      vVar12 = schema->m_type;
      aStack_358._8_8_ = 0x8000000000000000;
LAB_0012088f:
      aStack_358._M_allocated_capacity = 0;
      jStack_2f0 = (json_value)0x0;
      jStack_2e8.number_integer._0_4_ = 0;
      jStack_2e8.number_integer._4_1_ = 0;
      jStack_2e8.number_integer._5_2_ = 0;
      jStack_2e8.number_integer._7_1_ = 0;
      uStack_2e0 = 0;
      uStack_2da = 0x8000;
      if (vVar12 == array) goto LAB_001208ec;
      if (vVar12 == object) {
        jStack_2f0.object =
             (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        uStack_2e0 = 1;
        uStack_2da = 0;
      }
    }
    else {
      if (vVar12 != array) {
        jStack_360.object = (object_t *)0x0;
        aStack_358._8_8_ = 1;
        goto LAB_0012088f;
      }
      aStack_358._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      jStack_360.object = (object_t *)0x0;
      aStack_358._8_8_ = 0x8000000000000000;
LAB_001208ec:
      uStack_2da = 0x8000;
      uStack_2e0 = 0;
      jStack_2f0 = (json_value)0x0;
      sVar2 = ((schema->m_value).string)->_M_string_length;
      jStack_2e8.number_integer._0_4_ = (undefined4)sVar2;
      jStack_2e8.number_integer._4_1_ = (undefined1)(sVar2 >> 0x20);
      jStack_2e8.number_integer._5_2_ = (undefined2)(sVar2 >> 0x28);
      jStack_2e8.number_integer._7_1_ = (undefined1)(sVar2 >> 0x38);
    }
    uStack_2db = 0;
    uStack_2dd = 0;
    uStack_2de = 0;
    local_368 = (json_value)schema;
    local_2f8 = (json_value)schema;
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_368,
                        (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2f8);
    _Var28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00;
    if (!bVar13) {
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_368);
      local_2f8.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                (pbVar15,&local_2f8.number_float);
      *(undefined1 *)&(prVar14->content_check_)._M_invoker = 1;
      (prVar14->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_2f8;
      jStack_2e8.number_integer._0_4_ = 0x746c756d;
      jStack_2e8.number_integer._4_1_ = 0x69;
      jStack_2e8.number_integer._5_2_ = 0x6c70;
      jStack_2e8.number_integer._7_1_ = 0x65;
      uStack_2e0 = 0x664f;
      jStack_2f0 = (json_value)0xa;
      uStack_2de = 0;
      local_2f8.object = (object_t *)&jStack_2e8;
      pVar39 = std::
               _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::_M_insert_unique<std::__cxx11::string>
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_2f8);
      _Var28._M_pi = pVar39._8_8_;
      goto LAB_00120b5e;
    }
LAB_00120b7b:
    this = (type_schema *)&(prVar14->loader_).super__Function_base._M_manager;
    (local_238->super_schema)._vptr_schema = (_func_int **)this;
    (local_238->super_schema).root_ = prVar14;
    goto LAB_00122563;
  default:
    (this->super_schema)._vptr_schema = (_func_int **)0x0;
    (this->super_schema).root_ = (root_schema *)0x0;
    _Var28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT71(in_register_00000011,type);
    goto LAB_00122563;
  }
  *(undefined ***)&(this->super_schema).default_value_ = ppuVar27;
  (local_238->super_schema)._vptr_schema = (_func_int **)&(this->super_schema).default_value_;
  (local_238->super_schema).root_ = (root_schema *)this;
  _Var28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238;
LAB_00122563:
  sVar40.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var28._M_pi;
  sVar40.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_schema;
  return (shared_ptr<(anonymous_namespace)::schema>)
         sVar40.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<schema> type_schema::make(json &schema,
                                          json::value_t type,
                                          root_schema *root,
                                          const std::vector<nlohmann::json_uri> &uris,
                                          std::set<std::string> &kw)
{
	switch (type) {
	case json::value_t::null:
		return std::make_shared<null>(schema, root);

	case json::value_t::number_unsigned:
	case json::value_t::number_integer:
		return std::make_shared<numeric<json::number_integer_t>>(schema, root, kw);
	case json::value_t::number_float:
		return std::make_shared<numeric<json::number_float_t>>(schema, root, kw);
	case json::value_t::string:
		return std::make_shared<string>(schema, root);
	case json::value_t::boolean:
		return std::make_shared<boolean_type>(schema, root);
	case json::value_t::object:
		return std::make_shared<object>(schema, root, uris);
	case json::value_t::array:
		return std::make_shared<array>(schema, root, uris);

	case json::value_t::discarded: // not a real type - silence please
		break;

	case json::value_t::binary:
		break;
	}
	return nullptr;
}